

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  bool bVar65;
  bool bVar66;
  undefined1 auVar67 [32];
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [28];
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  long lVar92;
  uint uVar93;
  ulong uVar94;
  long lVar95;
  undefined8 uVar96;
  float fVar115;
  vint4 bi_2;
  undefined1 auVar97 [16];
  float fVar113;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar114;
  float fVar116;
  float fVar117;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined4 uVar121;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 extraout_var [56];
  float fVar142;
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar164 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  vint4 ai;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  vint4 bi;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined4 uVar194;
  vint4 ai_1;
  undefined1 auVar201 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar217 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar215;
  float fVar222;
  undefined1 auVar216 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar223 [32];
  float fVar224;
  float fVar230;
  float fVar231;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar229 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_8a0 [32];
  undefined1 local_820 [16];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [32];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 (*local_668) [16];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 local_610 [8];
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  undefined1 auStack_45c [8];
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2e0 [32];
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  uint local_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar94 = (ulong)(byte)PVar6;
  fVar143 = *(float *)(prim + uVar94 * 0x19 + 0x12);
  auVar201 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar201 = vinsertps_avx(auVar201,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar201 = vsubps_avx(auVar201,*(undefined1 (*) [16])(prim + uVar94 * 0x19 + 6));
  auVar97._0_4_ = fVar143 * auVar201._0_4_;
  auVar97._4_4_ = fVar143 * auVar201._4_4_;
  auVar97._8_4_ = fVar143 * auVar201._8_4_;
  auVar97._12_4_ = fVar143 * auVar201._12_4_;
  auVar176._0_4_ = fVar143 * auVar11._0_4_;
  auVar176._4_4_ = fVar143 * auVar11._4_4_;
  auVar176._8_4_ = fVar143 * auVar11._8_4_;
  auVar176._12_4_ = fVar143 * auVar11._12_4_;
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 5 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar94 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar91 = (ulong)(uint)((int)(uVar94 * 9) * 2);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + uVar94 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar91 = (ulong)(uint)((int)(uVar94 * 5) << 2);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar225._4_4_ = auVar176._0_4_;
  auVar225._0_4_ = auVar176._0_4_;
  auVar225._8_4_ = auVar176._0_4_;
  auVar225._12_4_ = auVar176._0_4_;
  auVar123 = vshufps_avx(auVar176,auVar176,0x55);
  auVar98 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar143 = auVar98._0_4_;
  auVar211._0_4_ = fVar143 * auVar12._0_4_;
  fVar113 = auVar98._4_4_;
  auVar211._4_4_ = fVar113 * auVar12._4_4_;
  fVar115 = auVar98._8_4_;
  auVar211._8_4_ = fVar115 * auVar12._8_4_;
  fVar142 = auVar98._12_4_;
  auVar211._12_4_ = fVar142 * auVar12._12_4_;
  auVar208._0_4_ = auVar15._0_4_ * fVar143;
  auVar208._4_4_ = auVar15._4_4_ * fVar113;
  auVar208._8_4_ = auVar15._8_4_ * fVar115;
  auVar208._12_4_ = auVar15._12_4_ * fVar142;
  auVar195._0_4_ = auVar144._0_4_ * fVar143;
  auVar195._4_4_ = auVar144._4_4_ * fVar113;
  auVar195._8_4_ = auVar144._8_4_ * fVar115;
  auVar195._12_4_ = auVar144._12_4_ * fVar142;
  auVar98 = vfmadd231ps_fma(auVar211,auVar123,auVar11);
  auVar124 = vfmadd231ps_fma(auVar208,auVar123,auVar14);
  auVar123 = vfmadd231ps_fma(auVar195,auVar99,auVar123);
  auVar162 = vfmadd231ps_fma(auVar98,auVar225,auVar201);
  auVar124 = vfmadd231ps_fma(auVar124,auVar225,auVar13);
  auVar172 = vfmadd231ps_fma(auVar123,auVar100,auVar225);
  auVar226._4_4_ = auVar97._0_4_;
  auVar226._0_4_ = auVar97._0_4_;
  auVar226._8_4_ = auVar97._0_4_;
  auVar226._12_4_ = auVar97._0_4_;
  auVar123 = vshufps_avx(auVar97,auVar97,0x55);
  auVar98 = vshufps_avx(auVar97,auVar97,0xaa);
  fVar143 = auVar98._0_4_;
  auVar177._0_4_ = fVar143 * auVar12._0_4_;
  fVar113 = auVar98._4_4_;
  auVar177._4_4_ = fVar113 * auVar12._4_4_;
  fVar115 = auVar98._8_4_;
  auVar177._8_4_ = fVar115 * auVar12._8_4_;
  fVar142 = auVar98._12_4_;
  auVar177._12_4_ = fVar142 * auVar12._12_4_;
  auVar122._0_4_ = auVar15._0_4_ * fVar143;
  auVar122._4_4_ = auVar15._4_4_ * fVar113;
  auVar122._8_4_ = auVar15._8_4_ * fVar115;
  auVar122._12_4_ = auVar15._12_4_ * fVar142;
  auVar98._0_4_ = auVar144._0_4_ * fVar143;
  auVar98._4_4_ = auVar144._4_4_ * fVar113;
  auVar98._8_4_ = auVar144._8_4_ * fVar115;
  auVar98._12_4_ = auVar144._12_4_ * fVar142;
  auVar11 = vfmadd231ps_fma(auVar177,auVar123,auVar11);
  auVar12 = vfmadd231ps_fma(auVar122,auVar123,auVar14);
  auVar14 = vfmadd231ps_fma(auVar98,auVar123,auVar99);
  auVar15 = vfmadd231ps_fma(auVar11,auVar226,auVar201);
  auVar99 = vfmadd231ps_fma(auVar12,auVar226,auVar13);
  auVar144 = vfmadd231ps_fma(auVar14,auVar226,auVar100);
  local_130._8_4_ = 0x7fffffff;
  local_130._0_8_ = 0x7fffffff7fffffff;
  local_130._12_4_ = 0x7fffffff;
  auVar201 = vandps_avx(auVar162,local_130);
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  auVar201 = vcmpps_avx(auVar201,auVar171,1);
  auVar11 = vblendvps_avx(auVar162,auVar171,auVar201);
  auVar201 = vandps_avx(auVar124,local_130);
  auVar201 = vcmpps_avx(auVar201,auVar171,1);
  auVar12 = vblendvps_avx(auVar124,auVar171,auVar201);
  auVar201 = vandps_avx(auVar172,local_130);
  auVar201 = vcmpps_avx(auVar201,auVar171,1);
  auVar201 = vblendvps_avx(auVar172,auVar171,auVar201);
  auVar13 = vrcpps_avx(auVar11);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = &DAT_3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar11 = vfnmadd213ps_fma(auVar11,auVar13,auVar189);
  auVar13 = vfmadd132ps_fma(auVar11,auVar13,auVar13);
  auVar11 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar11,auVar189);
  auVar14 = vfmadd132ps_fma(auVar12,auVar11,auVar11);
  auVar11 = vrcpps_avx(auVar201);
  auVar201 = vfnmadd213ps_fma(auVar201,auVar11,auVar189);
  auVar100 = vfmadd132ps_fma(auVar201,auVar11,auVar11);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar201 = vpmovsxwd_avx(auVar201);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar15);
  auVar172._0_4_ = auVar13._0_4_ * auVar201._0_4_;
  auVar172._4_4_ = auVar13._4_4_ * auVar201._4_4_;
  auVar172._8_4_ = auVar13._8_4_ * auVar201._8_4_;
  auVar172._12_4_ = auVar13._12_4_ * auVar201._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar94 * 9 + 6);
  auVar201 = vpmovsxwd_avx(auVar11);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar15);
  auVar178._0_4_ = auVar13._0_4_ * auVar201._0_4_;
  auVar178._4_4_ = auVar13._4_4_ * auVar201._4_4_;
  auVar178._8_4_ = auVar13._8_4_ * auVar201._8_4_;
  auVar178._12_4_ = auVar13._12_4_ * auVar201._12_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar6;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar11 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar94 * -2 + 6);
  auVar201 = vpmovsxwd_avx(auVar13);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar99);
  auVar196._0_4_ = auVar201._0_4_ * auVar14._0_4_;
  auVar196._4_4_ = auVar201._4_4_ * auVar14._4_4_;
  auVar196._8_4_ = auVar201._8_4_ * auVar14._8_4_;
  auVar196._12_4_ = auVar201._12_4_ * auVar14._12_4_;
  auVar201 = vcvtdq2ps_avx(auVar11);
  auVar201 = vsubps_avx(auVar201,auVar99);
  auVar123._0_4_ = auVar14._0_4_ * auVar201._0_4_;
  auVar123._4_4_ = auVar14._4_4_ * auVar201._4_4_;
  auVar123._8_4_ = auVar14._8_4_ * auVar201._8_4_;
  auVar123._12_4_ = auVar14._12_4_ * auVar201._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar91 + uVar94 + 6);
  auVar201 = vpmovsxwd_avx(auVar14);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar144);
  auVar162._0_4_ = auVar100._0_4_ * auVar201._0_4_;
  auVar162._4_4_ = auVar100._4_4_ * auVar201._4_4_;
  auVar162._8_4_ = auVar100._8_4_ * auVar201._8_4_;
  auVar162._12_4_ = auVar100._12_4_ * auVar201._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar94 * 0x17 + 6);
  auVar201 = vpmovsxwd_avx(auVar15);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar144);
  auVar99._0_4_ = auVar100._0_4_ * auVar201._0_4_;
  auVar99._4_4_ = auVar100._4_4_ * auVar201._4_4_;
  auVar99._8_4_ = auVar100._8_4_ * auVar201._8_4_;
  auVar99._12_4_ = auVar100._12_4_ * auVar201._12_4_;
  auVar201 = vpminsd_avx(auVar172,auVar178);
  auVar11 = vpminsd_avx(auVar196,auVar123);
  auVar201 = vmaxps_avx(auVar201,auVar11);
  auVar11 = vpminsd_avx(auVar162,auVar99);
  uVar121 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar200._4_4_ = uVar121;
  auVar200._0_4_ = uVar121;
  auVar200._8_4_ = uVar121;
  auVar200._12_4_ = uVar121;
  auVar11 = vmaxps_avx(auVar11,auVar200);
  auVar201 = vmaxps_avx(auVar201,auVar11);
  local_140._0_4_ = auVar201._0_4_ * 0.99999964;
  local_140._4_4_ = auVar201._4_4_ * 0.99999964;
  local_140._8_4_ = auVar201._8_4_ * 0.99999964;
  local_140._12_4_ = auVar201._12_4_ * 0.99999964;
  auVar201 = vpmaxsd_avx(auVar172,auVar178);
  auVar11 = vpmaxsd_avx(auVar196,auVar123);
  auVar201 = vminps_avx(auVar201,auVar11);
  auVar11 = vpmaxsd_avx(auVar162,auVar99);
  uVar121 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar144._4_4_ = uVar121;
  auVar144._0_4_ = uVar121;
  auVar144._8_4_ = uVar121;
  auVar144._12_4_ = uVar121;
  auVar11 = vminps_avx(auVar11,auVar144);
  auVar201 = vminps_avx(auVar201,auVar11);
  auVar100._0_4_ = auVar201._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar201._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar201._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar201._12_4_ * 1.0000004;
  auVar124[4] = PVar6;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar6;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar6;
  auVar124._13_3_ = 0;
  auVar11 = vpcmpgtd_avx(auVar124,_DAT_01ff0cf0);
  auVar201 = vcmpps_avx(local_140,auVar100,2);
  auVar201 = vandps_avx(auVar201,auVar11);
  uVar89 = vmovmskps_avx(auVar201);
  if (uVar89 != 0) {
    uVar89 = uVar89 & 0xff;
    local_528 = pre->ray_space + k;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_668 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      lVar17 = 0;
      for (uVar91 = (ulong)uVar89; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      local_820._4_4_ = *(undefined4 *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar17 * 4 + 6);
      pGVar9 = (context->scene->geometries).items[(uint)local_820._4_4_].ptr;
      uVar91 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               (ulong)uVar7 *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar95 = (long)pGVar9[1].intersectionFilterN * uVar91;
      lVar92 = (long)pGVar9[1].intersectionFilterN * (uVar91 + 1);
      lVar17 = *(long *)&pGVar9[1].time_range.upper;
      local_760 = *(undefined1 (*) [16])(lVar17 + lVar95);
      _local_610 = *(undefined1 (*) [16])(lVar17 + lVar92);
      uVar121 = *(undefined4 *)(lVar17 + 0xc + lVar95);
      auVar190._4_4_ = uVar121;
      auVar190._0_4_ = uVar121;
      auVar190._8_4_ = uVar121;
      auVar190._12_4_ = uVar121;
      local_e0._16_4_ = uVar121;
      local_e0._0_16_ = auVar190;
      local_e0._20_4_ = uVar121;
      local_e0._24_4_ = uVar121;
      local_e0._28_4_ = uVar121;
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar143 = *(float *)(lVar17 + 0xc + lVar92);
      auVar227._4_4_ = fVar143;
      auVar227._0_4_ = fVar143;
      auVar227._8_4_ = fVar143;
      auVar227._12_4_ = fVar143;
      fStack_f0 = fVar143;
      _local_100 = auVar227;
      fStack_ec = fVar143;
      fStack_e8 = fVar143;
      uStack_e4 = fVar143;
      lVar17 = (long)iVar8 * 0x44;
      auVar201 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar201 = vinsertps_avx(auVar201,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar125._8_4_ = 0xbeaaaaab;
      auVar125._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar125._12_4_ = 0xbeaaaaab;
      local_680 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar9[2].intersectionFilterN +
                                    uVar91 * (long)pGVar9[2].pointQueryFunc),local_760,auVar125);
      local_690 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar9[2].intersectionFilterN +
                                   (long)pGVar9[2].pointQueryFunc * (uVar91 + 1)),_local_610,
                                  auVar125);
      auVar12 = vsubps_avx(local_760,auVar201);
      uVar121 = auVar12._0_4_;
      auVar145._4_4_ = uVar121;
      auVar145._0_4_ = uVar121;
      auVar145._8_4_ = uVar121;
      auVar145._12_4_ = uVar121;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      aVar4 = (local_528->vx).field_0;
      aVar5 = (local_528->vy).field_0;
      fVar113 = (local_528->vz).field_0.m128[0];
      fVar115 = *(float *)((long)&(local_528->vz).field_0 + 4);
      fVar142 = *(float *)((long)&(local_528->vz).field_0 + 8);
      fVar114 = *(float *)((long)&(local_528->vz).field_0 + 0xc);
      auVar197._0_4_ = fVar113 * auVar12._0_4_;
      auVar197._4_4_ = fVar115 * auVar12._4_4_;
      auVar197._8_4_ = fVar142 * auVar12._8_4_;
      auVar197._12_4_ = fVar114 * auVar12._12_4_;
      auVar11 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar11);
      auVar15 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar145);
      auVar13 = vinsertps_avx(auVar15,auVar190,0x30);
      auVar12 = vsubps_avx(local_680,auVar201);
      uVar121 = auVar12._0_4_;
      auVar163._4_4_ = uVar121;
      auVar163._0_4_ = uVar121;
      auVar163._8_4_ = uVar121;
      auVar163._12_4_ = uVar121;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar209._0_4_ = fVar113 * auVar12._0_4_;
      auVar209._4_4_ = fVar115 * auVar12._4_4_;
      auVar209._8_4_ = fVar142 * auVar12._8_4_;
      auVar209._12_4_ = fVar114 * auVar12._12_4_;
      auVar11 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar5,auVar11);
      auVar100 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar163);
      auVar14 = vsubps_avx(local_690,auVar201);
      auVar11 = vshufps_avx(auVar14,auVar14,0x55);
      auVar12 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar191._0_4_ = fVar113 * auVar12._0_4_;
      auVar191._4_4_ = fVar115 * auVar12._4_4_;
      auVar191._8_4_ = fVar142 * auVar12._8_4_;
      auVar191._12_4_ = fVar114 * auVar12._12_4_;
      auVar12 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar5,auVar11);
      auVar11 = vblendps_avx(auVar100,local_680,8);
      auVar146._0_4_ = auVar14._0_4_;
      auVar146._4_4_ = auVar146._0_4_;
      auVar146._8_4_ = auVar146._0_4_;
      auVar146._12_4_ = auVar146._0_4_;
      auVar99 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar4,auVar146);
      auVar14 = vsubps_avx(_local_610,auVar201);
      auVar201 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar216._0_4_ = fVar113 * auVar201._0_4_;
      auVar216._4_4_ = fVar115 * auVar201._4_4_;
      auVar216._8_4_ = fVar142 * auVar201._8_4_;
      auVar216._12_4_ = fVar114 * auVar201._12_4_;
      auVar201 = vshufps_avx(auVar14,auVar14,0x55);
      auVar201 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar201);
      auVar12 = vblendps_avx(auVar99,local_690,8);
      auVar101._0_4_ = auVar14._0_4_;
      auVar101._4_4_ = auVar101._0_4_;
      auVar101._8_4_ = auVar101._0_4_;
      auVar101._12_4_ = auVar101._0_4_;
      auVar144 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar4,auVar101);
      auVar14 = vinsertps_avx(auVar144,auVar227,0x30);
      auVar201 = vandps_avx(auVar13,local_130);
      auVar11 = vandps_avx(auVar11,local_130);
      auVar13 = vmaxps_avx(auVar201,auVar11);
      auVar201 = vandps_avx(auVar12,local_130);
      auVar11 = vandps_avx(auVar14,local_130);
      auVar201 = vmaxps_avx(auVar201,auVar11);
      auVar201 = vmaxps_avx(auVar13,auVar201);
      auVar11 = vmovshdup_avx(auVar201);
      auVar11 = vmaxss_avx(auVar11,auVar201);
      auVar201 = vshufpd_avx(auVar201,auVar201,1);
      auVar201 = vmaxss_avx(auVar201,auVar11);
      auVar11 = vmovshdup_avx(auVar15);
      uVar96 = auVar11._0_8_;
      local_500._8_8_ = uVar96;
      local_500._0_8_ = uVar96;
      local_500._16_8_ = uVar96;
      local_500._24_8_ = uVar96;
      auVar11 = vmovshdup_avx(auVar100);
      uVar96 = auVar11._0_8_;
      local_4a0._8_8_ = uVar96;
      local_4a0._0_8_ = uVar96;
      local_4a0._16_8_ = uVar96;
      local_4a0._24_8_ = uVar96;
      auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x908);
      auVar11 = vmovshdup_avx(auVar99);
      uVar96 = auVar11._0_8_;
      local_6c0._8_8_ = uVar96;
      local_6c0._0_8_ = uVar96;
      local_6c0._16_8_ = uVar96;
      local_6c0._24_8_ = uVar96;
      auVar11 = vmovshdup_avx(auVar144);
      local_7a0 = auVar11._0_8_;
      uVar121 = auVar99._0_4_;
      local_7c0._4_4_ = uVar121;
      local_7c0._0_4_ = uVar121;
      local_7c0._8_4_ = uVar121;
      local_7c0._12_4_ = uVar121;
      local_7c0._16_4_ = uVar121;
      local_7c0._20_4_ = uVar121;
      local_7c0._24_4_ = uVar121;
      local_7c0._28_4_ = uVar121;
      local_1e0 = *(float *)(bezier_basis0 + lVar17 + 0xd8c);
      fStack_1dc = *(float *)(bezier_basis0 + lVar17 + 0xd90);
      fStack_1d8 = *(float *)(bezier_basis0 + lVar17 + 0xd94);
      fStack_1d4 = *(float *)(bezier_basis0 + lVar17 + 0xd98);
      fStack_1d0 = *(float *)(bezier_basis0 + lVar17 + 0xd9c);
      fStack_1cc = *(float *)(bezier_basis0 + lVar17 + 0xda0);
      fStack_1c8 = *(float *)(bezier_basis0 + lVar17 + 0xda4);
      local_700 = auVar144._0_4_;
      auVar166._0_4_ = local_1e0 * local_700;
      auVar166._4_4_ = fStack_1dc * local_700;
      auVar166._8_4_ = fStack_1d8 * local_700;
      auVar166._12_4_ = fStack_1d4 * local_700;
      auVar166._16_4_ = fStack_1d0 * local_700;
      auVar166._20_4_ = fStack_1cc * local_700;
      auVar166._24_4_ = fStack_1c8 * local_700;
      auVar166._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar166,auVar160,local_7c0);
      fVar113 = auVar11._0_4_;
      auVar155._0_4_ = local_1e0 * fVar113;
      fVar115 = auVar11._4_4_;
      auVar155._4_4_ = fStack_1dc * fVar115;
      auVar155._8_4_ = fStack_1d8 * fVar113;
      auVar155._12_4_ = fStack_1d4 * fVar115;
      auVar155._16_4_ = fStack_1d0 * fVar113;
      auVar155._20_4_ = fStack_1cc * fVar115;
      auVar155._24_4_ = fStack_1c8 * fVar113;
      auVar155._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar155,auVar160,local_6c0);
      auVar155 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x484);
      uVar194 = auVar100._0_4_;
      auVar187._4_4_ = uVar194;
      auVar187._0_4_ = uVar194;
      auVar187._8_4_ = uVar194;
      auVar187._12_4_ = uVar194;
      auVar187._16_4_ = uVar194;
      auVar187._20_4_ = uVar194;
      auVar187._24_4_ = uVar194;
      auVar187._28_4_ = uVar194;
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar155,auVar187);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar155,local_4a0);
      auVar166 = *(undefined1 (*) [32])(bezier_basis0 + lVar17);
      uVar194 = auVar15._0_4_;
      local_780._4_4_ = uVar194;
      local_780._0_4_ = uVar194;
      local_780._8_4_ = uVar194;
      local_780._12_4_ = uVar194;
      local_780._16_4_ = uVar194;
      local_780._20_4_ = uVar194;
      local_780._24_4_ = uVar194;
      local_780._28_4_ = uVar194;
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar166,local_780);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar166,local_500);
      local_200 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x908);
      fVar142 = *(float *)(bezier_basis1 + lVar17 + 0xd8c);
      fVar114 = *(float *)(bezier_basis1 + lVar17 + 0xd90);
      fVar116 = *(float *)(bezier_basis1 + lVar17 + 0xd94);
      fVar117 = *(float *)(bezier_basis1 + lVar17 + 0xd98);
      fVar118 = *(float *)(bezier_basis1 + lVar17 + 0xd9c);
      fVar119 = *(float *)(bezier_basis1 + lVar17 + 0xda0);
      fVar120 = *(float *)(bezier_basis1 + lVar17 + 0xda4);
      auVar110._4_4_ = fVar114 * local_700;
      auVar110._0_4_ = fVar142 * local_700;
      auVar110._8_4_ = fVar116 * local_700;
      auVar110._12_4_ = fVar117 * local_700;
      auVar110._16_4_ = fVar118 * local_700;
      auVar110._20_4_ = fVar119 * local_700;
      auVar110._24_4_ = fVar120 * local_700;
      auVar110._28_4_ = local_700;
      auVar13 = vfmadd231ps_fma(auVar110,local_200,local_7c0);
      auVar134._4_4_ = fVar114 * fVar115;
      auVar134._0_4_ = fVar142 * fVar113;
      auVar134._8_4_ = fVar116 * fVar113;
      auVar134._12_4_ = fVar117 * fVar115;
      auVar134._16_4_ = fVar118 * fVar113;
      auVar134._20_4_ = fVar119 * fVar115;
      auVar134._24_4_ = fVar120 * fVar113;
      auVar134._28_4_ = uVar121;
      auVar14 = vfmadd231ps_fma(auVar134,local_200,local_6c0);
      auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x484);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar110,auVar187);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar110,local_4a0);
      auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar17);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,local_780);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar134,local_500);
      auVar103 = ZEXT1632(auVar13);
      auVar167 = ZEXT1632(auVar12);
      local_1a0 = vsubps_avx(auVar103,auVar167);
      auVar129 = ZEXT1632(auVar14);
      auVar156 = ZEXT1632(auVar11);
      local_1c0 = vsubps_avx(auVar129,auVar156);
      auVar104._0_4_ = auVar11._0_4_ * local_1a0._0_4_;
      auVar104._4_4_ = auVar11._4_4_ * local_1a0._4_4_;
      auVar104._8_4_ = auVar11._8_4_ * local_1a0._8_4_;
      auVar104._12_4_ = auVar11._12_4_ * local_1a0._12_4_;
      auVar104._16_4_ = local_1a0._16_4_ * 0.0;
      auVar104._20_4_ = local_1a0._20_4_ * 0.0;
      auVar104._24_4_ = local_1a0._24_4_ * 0.0;
      auVar104._28_4_ = 0;
      fVar224 = local_1c0._0_4_;
      auVar130._0_4_ = fVar224 * auVar12._0_4_;
      fVar230 = local_1c0._4_4_;
      auVar130._4_4_ = fVar230 * auVar12._4_4_;
      fVar231 = local_1c0._8_4_;
      auVar130._8_4_ = fVar231 * auVar12._8_4_;
      fVar232 = local_1c0._12_4_;
      auVar130._12_4_ = fVar232 * auVar12._12_4_;
      fVar233 = local_1c0._16_4_;
      auVar130._16_4_ = fVar233 * 0.0;
      fVar234 = local_1c0._20_4_;
      auVar130._20_4_ = fVar234 * 0.0;
      fVar215 = local_1c0._24_4_;
      auVar130._24_4_ = fVar215 * 0.0;
      auVar130._28_4_ = 0;
      auVar104 = vsubps_avx(auVar104,auVar130);
      auVar11 = vpermilps_avx(local_680,0xff);
      uVar96 = auVar11._0_8_;
      local_80._8_8_ = uVar96;
      local_80._0_8_ = uVar96;
      local_80._16_8_ = uVar96;
      local_80._24_8_ = uVar96;
      auVar12 = vpermilps_avx(local_690,0xff);
      local_a0._0_8_ = auVar12._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar170 = ZEXT3264(_local_100);
      fStack_1c4 = (float)*(undefined4 *)(bezier_basis0 + lVar17 + 0xda8);
      auVar207._4_4_ = fStack_1dc * fVar143;
      auVar207._0_4_ = local_1e0 * fVar143;
      auVar207._8_4_ = fStack_1d8 * fVar143;
      auVar207._12_4_ = fStack_1d4 * fVar143;
      auVar207._16_4_ = fStack_1d0 * fVar143;
      auVar207._20_4_ = fStack_1cc * fVar143;
      auVar207._24_4_ = fStack_1c8 * fVar143;
      auVar207._28_4_ = *(undefined4 *)(bezier_basis0 + lVar17 + 0xda8);
      auVar12 = vfmadd231ps_fma(auVar207,local_a0,auVar160);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar155,local_80);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar166,local_e0);
      auVar203._4_4_ = fVar114 * fVar143;
      auVar203._0_4_ = fVar142 * fVar143;
      auVar203._8_4_ = fVar116 * fVar143;
      auVar203._12_4_ = fVar117 * fVar143;
      auVar203._16_4_ = fVar118 * fVar143;
      auVar203._20_4_ = fVar119 * fVar143;
      auVar203._24_4_ = fVar120 * fVar143;
      auVar203._28_4_ = auVar166._28_4_;
      auVar13 = vfmadd231ps_fma(auVar203,local_200,local_a0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar110,local_80);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,local_e0);
      auVar16._4_4_ = fVar230 * fVar230;
      auVar16._0_4_ = fVar224 * fVar224;
      auVar16._8_4_ = fVar231 * fVar231;
      auVar16._12_4_ = fVar232 * fVar232;
      auVar16._16_4_ = fVar233 * fVar233;
      auVar16._20_4_ = fVar234 * fVar234;
      auVar16._24_4_ = fVar215 * fVar215;
      auVar16._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar16,local_1a0,local_1a0);
      auVar207 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
      auVar168._4_4_ = auVar207._4_4_ * auVar207._4_4_ * auVar11._4_4_;
      auVar168._0_4_ = auVar207._0_4_ * auVar207._0_4_ * auVar11._0_4_;
      auVar168._8_4_ = auVar207._8_4_ * auVar207._8_4_ * auVar11._8_4_;
      auVar168._12_4_ = auVar207._12_4_ * auVar207._12_4_ * auVar11._12_4_;
      auVar168._16_4_ = auVar207._16_4_ * auVar207._16_4_ * 0.0;
      auVar168._20_4_ = auVar207._20_4_ * auVar207._20_4_ * 0.0;
      auVar168._24_4_ = auVar207._24_4_ * auVar207._24_4_ * 0.0;
      auVar168._28_4_ = auVar207._28_4_;
      auVar217._4_4_ = auVar104._4_4_ * auVar104._4_4_;
      auVar217._0_4_ = auVar104._0_4_ * auVar104._0_4_;
      auVar217._8_4_ = auVar104._8_4_ * auVar104._8_4_;
      auVar217._12_4_ = auVar104._12_4_ * auVar104._12_4_;
      auVar217._16_4_ = auVar104._16_4_ * auVar104._16_4_;
      auVar217._20_4_ = auVar104._20_4_ * auVar104._20_4_;
      auVar217._24_4_ = auVar104._24_4_ * auVar104._24_4_;
      auVar217._28_4_ = 0;
      auVar207 = vcmpps_avx(auVar217,auVar168,2);
      fVar143 = auVar201._0_4_ * 4.7683716e-07;
      auVar105._0_4_ = (float)iVar8;
      _auStack_45c = auVar144._4_12_;
      auVar105._4_4_ = auVar105._0_4_;
      auVar105._8_4_ = auVar105._0_4_;
      auVar105._12_4_ = auVar105._0_4_;
      auVar105._16_4_ = auVar105._0_4_;
      auVar105._20_4_ = auVar105._0_4_;
      auVar105._24_4_ = auVar105._0_4_;
      auVar105._28_4_ = auVar105._0_4_;
      auVar203 = vcmpps_avx(_DAT_02020f40,auVar105,1);
      auVar201 = vpermilps_avx(auVar15,0xaa);
      uVar96 = auVar201._0_8_;
      local_5c0._8_8_ = uVar96;
      local_5c0._0_8_ = uVar96;
      local_5c0._16_8_ = uVar96;
      local_5c0._24_8_ = uVar96;
      auVar201 = vpermilps_avx(auVar100,0xaa);
      uVar96 = auVar201._0_8_;
      local_120._8_8_ = uVar96;
      local_120._0_8_ = uVar96;
      local_120._16_8_ = uVar96;
      local_120._24_8_ = uVar96;
      auVar201 = vpermilps_avx(auVar99,0xaa);
      uVar96 = auVar201._0_8_;
      local_180._8_8_ = uVar96;
      local_180._0_8_ = uVar96;
      local_180._16_8_ = uVar96;
      local_180._24_8_ = uVar96;
      auVar201 = vshufps_avx(auVar144,auVar144,0xaa);
      uVar96 = auVar201._0_8_;
      register0x00001508 = uVar96;
      local_600 = uVar96;
      register0x00001510 = uVar96;
      register0x00001518 = uVar96;
      auVar220 = ZEXT3264(_local_600);
      auVar16 = auVar203 & auVar207;
      uVar93 = *(uint *)(ray + k * 4 + 0x30);
      local_720._0_16_ = ZEXT416(uVar93);
      fVar224 = fVar113;
      fVar230 = fVar115;
      fVar231 = fVar113;
      fVar232 = fVar115;
      fVar233 = fVar113;
      fVar234 = fVar115;
      uStack_798 = local_7a0;
      uStack_790 = local_7a0;
      uStack_788 = local_7a0;
      fStack_6fc = local_700;
      fStack_6f8 = local_700;
      fStack_6f4 = local_700;
      fStack_6f0 = local_700;
      fStack_6ec = local_700;
      fStack_6e8 = local_700;
      fStack_6e4 = local_700;
      local_460 = auVar105._0_4_;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar16 >> 0x7f,0) == '\0') &&
            (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar16 >> 0xbf,0) == '\0') &&
          (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar16[0x1f])
      {
        auVar141 = ZEXT3264(local_6c0);
        auVar229 = ZEXT3264(local_7c0);
        auVar192 = ZEXT3264(CONCAT428(local_700,
                                      CONCAT424(local_700,
                                                CONCAT420(local_700,
                                                          CONCAT416(local_700,
                                                                    CONCAT412(local_700,
                                                                              CONCAT48(local_700,
                                                                                       CONCAT44(
                                                  local_700,local_700))))))));
        auVar199 = ZEXT3264(local_780);
      }
      else {
        local_220 = vandps_avx(auVar207,auVar203);
        fVar215 = auVar201._0_4_;
        fVar222 = auVar201._4_4_;
        auVar223._4_4_ = fVar222 * fVar114;
        auVar223._0_4_ = fVar215 * fVar142;
        auVar223._8_4_ = fVar215 * fVar116;
        auVar223._12_4_ = fVar222 * fVar117;
        auVar223._16_4_ = fVar215 * fVar118;
        auVar223._20_4_ = fVar222 * fVar119;
        auVar223._24_4_ = fVar215 * fVar120;
        auVar223._28_4_ = local_220._28_4_;
        auVar201 = vfmadd213ps_fma(local_200,local_180,auVar223);
        auVar201 = vfmadd213ps_fma(auVar110,local_120,ZEXT1632(auVar201));
        auVar201 = vfmadd213ps_fma(auVar134,local_5c0,ZEXT1632(auVar201));
        local_6e0 = ZEXT1632(auVar201);
        auVar106._0_4_ = fVar215 * local_1e0;
        auVar106._4_4_ = fVar222 * fStack_1dc;
        auVar106._8_4_ = fVar215 * fStack_1d8;
        auVar106._12_4_ = fVar222 * fStack_1d4;
        auVar106._16_4_ = fVar215 * fStack_1d0;
        auVar106._20_4_ = fVar222 * fStack_1cc;
        auVar106._24_4_ = fVar215 * fStack_1c8;
        auVar106._28_4_ = 0;
        auVar201 = vfmadd213ps_fma(auVar160,local_180,auVar106);
        auVar201 = vfmadd213ps_fma(auVar155,local_120,ZEXT1632(auVar201));
        auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x1210);
        auVar155 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x1694);
        auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x1b18);
        fVar142 = *(float *)(bezier_basis0 + lVar17 + 0x1f9c);
        fVar114 = *(float *)(bezier_basis0 + lVar17 + 0x1fa0);
        fVar116 = *(float *)(bezier_basis0 + lVar17 + 0x1fa4);
        fVar117 = *(float *)(bezier_basis0 + lVar17 + 0x1fa8);
        fVar118 = *(float *)(bezier_basis0 + lVar17 + 0x1fac);
        fVar119 = *(float *)(bezier_basis0 + lVar17 + 0x1fb0);
        fVar120 = *(float *)(bezier_basis0 + lVar17 + 0x1fb4);
        auVar18._4_4_ = local_700 * fVar114;
        auVar18._0_4_ = local_700 * fVar142;
        auVar18._8_4_ = local_700 * fVar116;
        auVar18._12_4_ = local_700 * fVar117;
        auVar18._16_4_ = local_700 * fVar118;
        auVar18._20_4_ = local_700 * fVar119;
        auVar18._24_4_ = local_700 * fVar120;
        auVar18._28_4_ = auVar104._28_4_;
        auVar202._0_4_ = fVar142 * fVar113;
        auVar202._4_4_ = fVar114 * fVar115;
        auVar202._8_4_ = fVar116 * fVar113;
        auVar202._12_4_ = fVar117 * fVar115;
        auVar202._16_4_ = fVar118 * fVar113;
        auVar202._20_4_ = fVar119 * fVar115;
        auVar202._24_4_ = fVar120 * fVar113;
        auVar202._28_4_ = 0;
        auVar19._4_4_ = fVar114 * fVar222;
        auVar19._0_4_ = fVar142 * fVar215;
        auVar19._8_4_ = fVar116 * fVar215;
        auVar19._12_4_ = fVar117 * fVar222;
        auVar19._16_4_ = fVar118 * fVar215;
        auVar19._20_4_ = fVar119 * fVar222;
        auVar19._24_4_ = fVar120 * fVar215;
        auVar19._28_4_ = *(undefined4 *)(bezier_basis1 + lVar17 + 0xda8);
        auVar11 = vfmadd231ps_fma(auVar18,auVar110,local_7c0);
        auVar14 = vfmadd231ps_fma(auVar202,auVar110,local_6c0);
        auVar15 = vfmadd231ps_fma(auVar19,local_180,auVar110);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar155,auVar187);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar155,local_4a0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_120,auVar155);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar160,local_780);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar160,local_500);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar160,local_5c0);
        fVar142 = *(float *)(bezier_basis1 + lVar17 + 0x1f9c);
        fVar114 = *(float *)(bezier_basis1 + lVar17 + 0x1fa0);
        fVar116 = *(float *)(bezier_basis1 + lVar17 + 0x1fa4);
        fVar117 = *(float *)(bezier_basis1 + lVar17 + 0x1fa8);
        fVar118 = *(float *)(bezier_basis1 + lVar17 + 0x1fac);
        fVar119 = *(float *)(bezier_basis1 + lVar17 + 0x1fb0);
        fVar120 = *(float *)(bezier_basis1 + lVar17 + 0x1fb4);
        auVar212._0_4_ = local_700 * fVar142;
        auVar212._4_4_ = local_700 * fVar114;
        auVar212._8_4_ = local_700 * fVar116;
        auVar212._12_4_ = local_700 * fVar117;
        auVar212._16_4_ = local_700 * fVar118;
        auVar212._20_4_ = local_700 * fVar119;
        auVar212._24_4_ = local_700 * fVar120;
        auVar212._28_4_ = 0;
        auVar20._4_4_ = fVar115 * fVar114;
        auVar20._0_4_ = fVar113 * fVar142;
        auVar20._8_4_ = fVar113 * fVar116;
        auVar20._12_4_ = fVar115 * fVar117;
        auVar20._16_4_ = fVar113 * fVar118;
        auVar20._20_4_ = fVar115 * fVar119;
        auVar20._24_4_ = fVar113 * fVar120;
        auVar20._28_4_ = local_700;
        auVar21._4_4_ = fVar222 * fVar114;
        auVar21._0_4_ = fVar215 * fVar142;
        auVar21._8_4_ = fVar215 * fVar116;
        auVar21._12_4_ = fVar222 * fVar117;
        auVar21._16_4_ = fVar215 * fVar118;
        auVar21._20_4_ = fVar222 * fVar119;
        auVar21._24_4_ = fVar215 * fVar120;
        auVar21._28_4_ = fVar222;
        auVar160 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x1b18);
        auVar100 = vfmadd231ps_fma(auVar212,auVar160,local_7c0);
        auVar99 = vfmadd231ps_fma(auVar20,auVar160,local_6c0);
        auVar144 = vfmadd231ps_fma(auVar21,local_180,auVar160);
        auVar160 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x1694);
        auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar160,auVar187);
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar160,local_4a0);
        auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),local_120,auVar160);
        auVar160 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x1210);
        auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar160,local_780);
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar160,local_500);
        auVar131._8_4_ = 0x7fffffff;
        auVar131._0_8_ = 0x7fffffff7fffffff;
        auVar131._12_4_ = 0x7fffffff;
        auVar131._16_4_ = 0x7fffffff;
        auVar131._20_4_ = 0x7fffffff;
        auVar131._24_4_ = 0x7fffffff;
        auVar131._28_4_ = 0x7fffffff;
        auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),local_5c0,auVar160);
        auVar160 = vandps_avx(ZEXT1632(auVar11),auVar131);
        auVar155 = vandps_avx(ZEXT1632(auVar14),auVar131);
        auVar155 = vmaxps_avx(auVar160,auVar155);
        auVar160 = vandps_avx(ZEXT1632(auVar15),auVar131);
        auVar160 = vmaxps_avx(auVar155,auVar160);
        auVar157._4_4_ = fVar143;
        auVar157._0_4_ = fVar143;
        auVar157._8_4_ = fVar143;
        auVar157._12_4_ = fVar143;
        auVar157._16_4_ = fVar143;
        auVar157._20_4_ = fVar143;
        auVar157._24_4_ = fVar143;
        auVar157._28_4_ = fVar143;
        auVar160 = vcmpps_avx(auVar160,auVar157,1);
        auVar110 = vblendvps_avx(ZEXT1632(auVar11),local_1a0,auVar160);
        auVar134 = vblendvps_avx(ZEXT1632(auVar14),local_1c0,auVar160);
        auVar160 = vandps_avx(ZEXT1632(auVar100),auVar131);
        auVar155 = vandps_avx(ZEXT1632(auVar99),auVar131);
        auVar155 = vmaxps_avx(auVar160,auVar155);
        auVar160 = vandps_avx(ZEXT1632(auVar144),auVar131);
        auVar160 = vmaxps_avx(auVar155,auVar160);
        auVar207 = vcmpps_avx(auVar160,auVar157,1);
        auVar160 = vblendvps_avx(ZEXT1632(auVar100),local_1a0,auVar207);
        auVar155 = vblendvps_avx(ZEXT1632(auVar99),local_1c0,auVar207);
        auVar201 = vfmadd213ps_fma(auVar166,local_5c0,ZEXT1632(auVar201));
        auVar11 = vfmadd213ps_fma(auVar110,auVar110,ZEXT832(0) << 0x20);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,auVar134);
        auVar166 = vrsqrtps_avx(ZEXT1632(auVar11));
        fVar142 = auVar166._0_4_;
        fVar114 = auVar166._4_4_;
        fVar116 = auVar166._8_4_;
        fVar117 = auVar166._12_4_;
        fVar118 = auVar166._16_4_;
        fVar119 = auVar166._20_4_;
        fVar120 = auVar166._24_4_;
        auVar22._4_4_ = fVar114 * fVar114 * fVar114 * auVar11._4_4_ * -0.5;
        auVar22._0_4_ = fVar142 * fVar142 * fVar142 * auVar11._0_4_ * -0.5;
        auVar22._8_4_ = fVar116 * fVar116 * fVar116 * auVar11._8_4_ * -0.5;
        auVar22._12_4_ = fVar117 * fVar117 * fVar117 * auVar11._12_4_ * -0.5;
        auVar22._16_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar22._20_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar22._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar22._28_4_ = 0;
        auVar213._8_4_ = 0x3fc00000;
        auVar213._0_8_ = 0x3fc000003fc00000;
        auVar213._12_4_ = 0x3fc00000;
        auVar213._16_4_ = 0x3fc00000;
        auVar213._20_4_ = 0x3fc00000;
        auVar213._24_4_ = 0x3fc00000;
        auVar213._28_4_ = 0x3fc00000;
        auVar11 = vfmadd231ps_fma(auVar22,auVar213,auVar166);
        fVar142 = auVar11._0_4_;
        fVar114 = auVar11._4_4_;
        auVar23._4_4_ = auVar134._4_4_ * fVar114;
        auVar23._0_4_ = auVar134._0_4_ * fVar142;
        fVar116 = auVar11._8_4_;
        auVar23._8_4_ = auVar134._8_4_ * fVar116;
        fVar117 = auVar11._12_4_;
        auVar23._12_4_ = auVar134._12_4_ * fVar117;
        auVar23._16_4_ = auVar134._16_4_ * 0.0;
        auVar23._20_4_ = auVar134._20_4_ * 0.0;
        auVar23._24_4_ = auVar134._24_4_ * 0.0;
        auVar23._28_4_ = auVar166._28_4_;
        auVar24._4_4_ = -auVar110._4_4_ * fVar114;
        auVar24._0_4_ = -auVar110._0_4_ * fVar142;
        auVar24._8_4_ = -auVar110._8_4_ * fVar116;
        auVar24._12_4_ = -auVar110._12_4_ * fVar117;
        auVar24._16_4_ = -auVar110._16_4_ * 0.0;
        auVar24._20_4_ = -auVar110._20_4_ * 0.0;
        auVar24._24_4_ = -auVar110._24_4_ * 0.0;
        auVar24._28_4_ = 0x80000000;
        auVar11 = vfmadd213ps_fma(auVar160,auVar160,ZEXT832(0) << 0x20);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar155,auVar155);
        auVar166 = vrsqrtps_avx(ZEXT1632(auVar11));
        auVar25._28_4_ = auVar207._28_4_;
        auVar25._0_28_ =
             ZEXT1628(CONCAT412(fVar117 * 0.0,
                                CONCAT48(fVar116 * 0.0,CONCAT44(fVar114 * 0.0,fVar142 * 0.0))));
        fVar142 = auVar166._0_4_;
        fVar114 = auVar166._4_4_;
        fVar116 = auVar166._8_4_;
        fVar117 = auVar166._12_4_;
        fVar118 = auVar166._16_4_;
        fVar119 = auVar166._20_4_;
        fVar120 = auVar166._24_4_;
        auVar26._4_4_ = fVar114 * fVar114 * fVar114 * auVar11._4_4_ * -0.5;
        auVar26._0_4_ = fVar142 * fVar142 * fVar142 * auVar11._0_4_ * -0.5;
        auVar26._8_4_ = fVar116 * fVar116 * fVar116 * auVar11._8_4_ * -0.5;
        auVar26._12_4_ = fVar117 * fVar117 * fVar117 * auVar11._12_4_ * -0.5;
        auVar26._16_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar26._20_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar26._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar26._28_4_ = 0;
        auVar11 = vfmadd231ps_fma(auVar26,auVar213,auVar166);
        fVar142 = auVar11._0_4_;
        fVar114 = auVar11._4_4_;
        auVar27._4_4_ = auVar155._4_4_ * fVar114;
        auVar27._0_4_ = auVar155._0_4_ * fVar142;
        fVar116 = auVar11._8_4_;
        auVar27._8_4_ = auVar155._8_4_ * fVar116;
        fVar117 = auVar11._12_4_;
        auVar27._12_4_ = auVar155._12_4_ * fVar117;
        auVar27._16_4_ = auVar155._16_4_ * 0.0;
        auVar27._20_4_ = auVar155._20_4_ * 0.0;
        auVar27._24_4_ = auVar155._24_4_ * 0.0;
        auVar27._28_4_ = auVar155._28_4_;
        auVar28._4_4_ = fVar114 * -auVar160._4_4_;
        auVar28._0_4_ = fVar142 * -auVar160._0_4_;
        auVar28._8_4_ = fVar116 * -auVar160._8_4_;
        auVar28._12_4_ = fVar117 * -auVar160._12_4_;
        auVar28._16_4_ = -auVar160._16_4_ * 0.0;
        auVar28._20_4_ = -auVar160._20_4_ * 0.0;
        auVar28._24_4_ = -auVar160._24_4_ * 0.0;
        auVar28._28_4_ = auVar110._28_4_ ^ 0x80000000;
        auVar160._28_4_ = auVar166._28_4_;
        auVar160._0_28_ =
             ZEXT1628(CONCAT412(fVar117 * 0.0,
                                CONCAT48(fVar116 * 0.0,CONCAT44(fVar114 * 0.0,fVar142 * 0.0))));
        auVar11 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar12),auVar167);
        auVar223 = ZEXT1632(auVar12);
        auVar12 = vfmadd213ps_fma(auVar24,auVar223,auVar156);
        auVar14 = vfmadd213ps_fma(auVar25,auVar223,ZEXT1632(auVar201));
        auVar123 = vfnmadd213ps_fma(auVar23,auVar223,auVar167);
        auVar15 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar13),auVar103);
        auVar98 = vfnmadd213ps_fma(auVar24,auVar223,auVar156);
        auVar155 = ZEXT1632(auVar13);
        auVar100 = vfmadd213ps_fma(auVar28,auVar155,auVar129);
        auVar172 = vfnmadd231ps_fma(ZEXT1632(auVar201),auVar223,auVar25);
        auVar99 = vfmadd213ps_fma(auVar160,auVar155,local_6e0);
        auVar124 = vfnmadd213ps_fma(auVar27,auVar155,auVar103);
        auVar162 = vfnmadd213ps_fma(auVar28,auVar155,auVar129);
        auVar97 = vfnmadd231ps_fma(local_6e0,ZEXT1632(auVar13),auVar160);
        auVar160 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar98));
        auVar155 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar172));
        auVar103._4_4_ = auVar172._4_4_ * auVar160._4_4_;
        auVar103._0_4_ = auVar172._0_4_ * auVar160._0_4_;
        auVar103._8_4_ = auVar172._8_4_ * auVar160._8_4_;
        auVar103._12_4_ = auVar172._12_4_ * auVar160._12_4_;
        auVar103._16_4_ = auVar160._16_4_ * 0.0;
        auVar103._20_4_ = auVar160._20_4_ * 0.0;
        auVar103._24_4_ = auVar160._24_4_ * 0.0;
        auVar103._28_4_ = 0;
        auVar144 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar98),auVar155);
        auVar129._4_4_ = auVar123._4_4_ * auVar155._4_4_;
        auVar129._0_4_ = auVar123._0_4_ * auVar155._0_4_;
        auVar129._8_4_ = auVar123._8_4_ * auVar155._8_4_;
        auVar129._12_4_ = auVar123._12_4_ * auVar155._12_4_;
        auVar129._16_4_ = auVar155._16_4_ * 0.0;
        auVar129._20_4_ = auVar155._20_4_ * 0.0;
        auVar129._24_4_ = auVar155._24_4_ * 0.0;
        auVar129._28_4_ = auVar155._28_4_;
        auVar203 = ZEXT1632(auVar123);
        auVar155 = vsubps_avx(ZEXT1632(auVar15),auVar203);
        auVar201 = vfmsub231ps_fma(auVar129,ZEXT1632(auVar172),auVar155);
        auVar156._4_4_ = auVar98._4_4_ * auVar155._4_4_;
        auVar156._0_4_ = auVar98._0_4_ * auVar155._0_4_;
        auVar156._8_4_ = auVar98._8_4_ * auVar155._8_4_;
        auVar156._12_4_ = auVar98._12_4_ * auVar155._12_4_;
        auVar156._16_4_ = auVar155._16_4_ * 0.0;
        auVar156._20_4_ = auVar155._20_4_ * 0.0;
        auVar156._24_4_ = auVar155._24_4_ * 0.0;
        auVar156._28_4_ = auVar155._28_4_;
        auVar123 = vfmsub231ps_fma(auVar156,auVar203,auVar160);
        auVar160 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar201 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar160,ZEXT1632(auVar201));
        auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar160,ZEXT1632(auVar144));
        auVar168 = vcmpps_avx(ZEXT1632(auVar201),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar170 = ZEXT3264(auVar168);
        auVar160 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar11),auVar168);
        auVar155 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar12),auVar168);
        auVar166 = vblendvps_avx(ZEXT1632(auVar97),ZEXT1632(auVar14),auVar168);
        auVar110 = vblendvps_avx(auVar203,ZEXT1632(auVar15),auVar168);
        auVar134 = vblendvps_avx(ZEXT1632(auVar98),ZEXT1632(auVar100),auVar168);
        auVar207 = vblendvps_avx(ZEXT1632(auVar172),ZEXT1632(auVar99),auVar168);
        auVar203 = vblendvps_avx(ZEXT1632(auVar15),auVar203,auVar168);
        auVar104 = vblendvps_avx(ZEXT1632(auVar100),ZEXT1632(auVar98),auVar168);
        auVar201 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
        auVar16 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar172),auVar168);
        auVar217 = vsubps_avx(auVar203,auVar160);
        auVar104 = vsubps_avx(auVar104,auVar155);
        auVar103 = vsubps_avx(auVar16,auVar166);
        auVar129 = vsubps_avx(auVar160,auVar110);
        auVar130 = vsubps_avx(auVar155,auVar134);
        auVar156 = vsubps_avx(auVar166,auVar207);
        auVar167._4_4_ = auVar103._4_4_ * auVar160._4_4_;
        auVar167._0_4_ = auVar103._0_4_ * auVar160._0_4_;
        auVar167._8_4_ = auVar103._8_4_ * auVar160._8_4_;
        auVar167._12_4_ = auVar103._12_4_ * auVar160._12_4_;
        auVar167._16_4_ = auVar103._16_4_ * auVar160._16_4_;
        auVar167._20_4_ = auVar103._20_4_ * auVar160._20_4_;
        auVar167._24_4_ = auVar103._24_4_ * auVar160._24_4_;
        auVar167._28_4_ = auVar16._28_4_;
        auVar11 = vfmsub231ps_fma(auVar167,auVar166,auVar217);
        auVar29._4_4_ = auVar217._4_4_ * auVar155._4_4_;
        auVar29._0_4_ = auVar217._0_4_ * auVar155._0_4_;
        auVar29._8_4_ = auVar217._8_4_ * auVar155._8_4_;
        auVar29._12_4_ = auVar217._12_4_ * auVar155._12_4_;
        auVar29._16_4_ = auVar217._16_4_ * auVar155._16_4_;
        auVar29._20_4_ = auVar217._20_4_ * auVar155._20_4_;
        auVar29._24_4_ = auVar217._24_4_ * auVar155._24_4_;
        auVar29._28_4_ = auVar203._28_4_;
        auVar12 = vfmsub231ps_fma(auVar29,auVar160,auVar104);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar107._0_4_ = auVar104._0_4_ * auVar166._0_4_;
        auVar107._4_4_ = auVar104._4_4_ * auVar166._4_4_;
        auVar107._8_4_ = auVar104._8_4_ * auVar166._8_4_;
        auVar107._12_4_ = auVar104._12_4_ * auVar166._12_4_;
        auVar107._16_4_ = auVar104._16_4_ * auVar166._16_4_;
        auVar107._20_4_ = auVar104._20_4_ * auVar166._20_4_;
        auVar107._24_4_ = auVar104._24_4_ * auVar166._24_4_;
        auVar107._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar107,auVar155,auVar103);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar108._0_4_ = auVar156._0_4_ * auVar110._0_4_;
        auVar108._4_4_ = auVar156._4_4_ * auVar110._4_4_;
        auVar108._8_4_ = auVar156._8_4_ * auVar110._8_4_;
        auVar108._12_4_ = auVar156._12_4_ * auVar110._12_4_;
        auVar108._16_4_ = auVar156._16_4_ * auVar110._16_4_;
        auVar108._20_4_ = auVar156._20_4_ * auVar110._20_4_;
        auVar108._24_4_ = auVar156._24_4_ * auVar110._24_4_;
        auVar108._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar108,auVar129,auVar207);
        auVar30._4_4_ = auVar130._4_4_ * auVar207._4_4_;
        auVar30._0_4_ = auVar130._0_4_ * auVar207._0_4_;
        auVar30._8_4_ = auVar130._8_4_ * auVar207._8_4_;
        auVar30._12_4_ = auVar130._12_4_ * auVar207._12_4_;
        auVar30._16_4_ = auVar130._16_4_ * auVar207._16_4_;
        auVar30._20_4_ = auVar130._20_4_ * auVar207._20_4_;
        auVar30._24_4_ = auVar130._24_4_ * auVar207._24_4_;
        auVar30._28_4_ = auVar207._28_4_;
        auVar14 = vfmsub231ps_fma(auVar30,auVar134,auVar156);
        auVar31._4_4_ = auVar129._4_4_ * auVar134._4_4_;
        auVar31._0_4_ = auVar129._0_4_ * auVar134._0_4_;
        auVar31._8_4_ = auVar129._8_4_ * auVar134._8_4_;
        auVar31._12_4_ = auVar129._12_4_ * auVar134._12_4_;
        auVar31._16_4_ = auVar129._16_4_ * auVar134._16_4_;
        auVar31._20_4_ = auVar129._20_4_ * auVar134._20_4_;
        auVar31._24_4_ = auVar129._24_4_ * auVar134._24_4_;
        auVar31._28_4_ = auVar134._28_4_;
        auVar15 = vfmsub231ps_fma(auVar31,auVar130,auVar110);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar110 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar14));
        auVar110 = vcmpps_avx(auVar110,ZEXT832(0) << 0x20,2);
        auVar11 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar201 = vpand_avx(auVar11,auVar201);
        auVar110 = vpmovsxwd_avx2(auVar201);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) {
LAB_0169e34b:
          auVar192 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar210 = ZEXT3264(local_580);
          auVar141 = ZEXT3264(local_5a0);
        }
        else {
          auVar32._4_4_ = auVar104._4_4_ * auVar156._4_4_;
          auVar32._0_4_ = auVar104._0_4_ * auVar156._0_4_;
          auVar32._8_4_ = auVar104._8_4_ * auVar156._8_4_;
          auVar32._12_4_ = auVar104._12_4_ * auVar156._12_4_;
          auVar32._16_4_ = auVar104._16_4_ * auVar156._16_4_;
          auVar32._20_4_ = auVar104._20_4_ * auVar156._20_4_;
          auVar32._24_4_ = auVar104._24_4_ * auVar156._24_4_;
          auVar32._28_4_ = auVar110._28_4_;
          auVar99 = vfmsub231ps_fma(auVar32,auVar130,auVar103);
          auVar132._0_4_ = auVar129._0_4_ * auVar103._0_4_;
          auVar132._4_4_ = auVar129._4_4_ * auVar103._4_4_;
          auVar132._8_4_ = auVar129._8_4_ * auVar103._8_4_;
          auVar132._12_4_ = auVar129._12_4_ * auVar103._12_4_;
          auVar132._16_4_ = auVar129._16_4_ * auVar103._16_4_;
          auVar132._20_4_ = auVar129._20_4_ * auVar103._20_4_;
          auVar132._24_4_ = auVar129._24_4_ * auVar103._24_4_;
          auVar132._28_4_ = 0;
          auVar100 = vfmsub231ps_fma(auVar132,auVar217,auVar156);
          auVar33._4_4_ = auVar217._4_4_ * auVar130._4_4_;
          auVar33._0_4_ = auVar217._0_4_ * auVar130._0_4_;
          auVar33._8_4_ = auVar217._8_4_ * auVar130._8_4_;
          auVar33._12_4_ = auVar217._12_4_ * auVar130._12_4_;
          auVar33._16_4_ = auVar217._16_4_ * auVar130._16_4_;
          auVar33._20_4_ = auVar217._20_4_ * auVar130._20_4_;
          auVar33._24_4_ = auVar217._24_4_ * auVar130._24_4_;
          auVar33._28_4_ = auVar217._28_4_;
          auVar144 = vfmsub231ps_fma(auVar33,auVar129,auVar104);
          auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar144));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar99),_DAT_02020f00);
          auVar110 = vrcpps_avx(ZEXT1632(auVar15));
          auVar214._8_4_ = 0x3f800000;
          auVar214._0_8_ = &DAT_3f8000003f800000;
          auVar214._12_4_ = 0x3f800000;
          auVar214._16_4_ = 0x3f800000;
          auVar214._20_4_ = 0x3f800000;
          auVar214._24_4_ = 0x3f800000;
          auVar214._28_4_ = 0x3f800000;
          auVar11 = vfnmadd213ps_fma(auVar110,ZEXT1632(auVar15),auVar214);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar110,auVar110);
          auVar183._0_4_ = auVar166._0_4_ * auVar144._0_4_;
          auVar183._4_4_ = auVar166._4_4_ * auVar144._4_4_;
          auVar183._8_4_ = auVar166._8_4_ * auVar144._8_4_;
          auVar183._12_4_ = auVar166._12_4_ * auVar144._12_4_;
          auVar183._16_4_ = auVar166._16_4_ * 0.0;
          auVar183._20_4_ = auVar166._20_4_ * 0.0;
          auVar183._24_4_ = auVar166._24_4_ * 0.0;
          auVar183._28_4_ = 0;
          auVar100 = vfmadd231ps_fma(auVar183,auVar155,ZEXT1632(auVar100));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar99),auVar160);
          fVar142 = auVar11._0_4_;
          fVar114 = auVar11._4_4_;
          fVar116 = auVar11._8_4_;
          fVar117 = auVar11._12_4_;
          auVar166 = ZEXT1632(CONCAT412(fVar117 * auVar100._12_4_,
                                        CONCAT48(fVar116 * auVar100._8_4_,
                                                 CONCAT44(fVar114 * auVar100._4_4_,
                                                          fVar142 * auVar100._0_4_))));
          auVar109._4_4_ = uVar93;
          auVar109._0_4_ = uVar93;
          auVar109._8_4_ = uVar93;
          auVar109._12_4_ = uVar93;
          auVar109._16_4_ = uVar93;
          auVar109._20_4_ = uVar93;
          auVar109._24_4_ = uVar93;
          auVar109._28_4_ = uVar93;
          uVar121 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar133._4_4_ = uVar121;
          auVar133._0_4_ = uVar121;
          auVar133._8_4_ = uVar121;
          auVar133._12_4_ = uVar121;
          auVar133._16_4_ = uVar121;
          auVar133._20_4_ = uVar121;
          auVar133._24_4_ = uVar121;
          auVar133._28_4_ = uVar121;
          auVar160 = vcmpps_avx(auVar109,auVar166,2);
          auVar155 = vcmpps_avx(auVar166,auVar133,2);
          auVar160 = vandps_avx(auVar155,auVar160);
          auVar11 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar201 = vpand_avx(auVar201,auVar11);
          auVar160 = vpmovsxwd_avx2(auVar201);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar160 >> 0x7f,0) == '\0') &&
                (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0xbf,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar160[0x1f]) goto LAB_0169e34b;
          auVar160 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,4);
          auVar11 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar201 = vpand_avx(auVar201,auVar11);
          auVar160 = vpmovsxwd_avx2(auVar201);
          auVar192 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar210 = ZEXT3264(local_580);
          auVar141 = ZEXT3264(local_5a0);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            auVar110 = ZEXT1632(CONCAT412(fVar117 * auVar12._12_4_,
                                          CONCAT48(fVar116 * auVar12._8_4_,
                                                   CONCAT44(fVar114 * auVar12._4_4_,
                                                            fVar142 * auVar12._0_4_))));
            auVar134 = ZEXT1632(CONCAT412(fVar117 * auVar14._12_4_,
                                          CONCAT48(fVar116 * auVar14._8_4_,
                                                   CONCAT44(fVar114 * auVar14._4_4_,
                                                            fVar142 * auVar14._0_4_))));
            auVar175._8_4_ = 0x3f800000;
            auVar175._0_8_ = &DAT_3f8000003f800000;
            auVar175._12_4_ = 0x3f800000;
            auVar175._16_4_ = 0x3f800000;
            auVar175._20_4_ = 0x3f800000;
            auVar175._24_4_ = 0x3f800000;
            auVar175._28_4_ = 0x3f800000;
            auVar155 = vsubps_avx(auVar175,auVar110);
            auVar155 = vblendvps_avx(auVar155,auVar110,auVar168);
            auVar210 = ZEXT3264(auVar155);
            auVar155 = vsubps_avx(auVar175,auVar134);
            local_240 = vblendvps_avx(auVar155,auVar134,auVar168);
            auVar192 = ZEXT3264(auVar160);
            auVar141 = ZEXT3264(auVar166);
          }
        }
        auVar229 = ZEXT3264(local_7c0);
        auVar220 = ZEXT3264(_local_600);
        local_580 = auVar210._0_32_;
        local_5a0 = auVar141._0_32_;
        auVar160 = auVar192._0_32_;
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0x7f,0) == '\0') &&
              (auVar192 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar160 >> 0xbf,0) == '\0') &&
            (auVar192 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar192[0x1f]) {
          auVar141 = ZEXT3264(local_6c0);
          auVar192 = ZEXT3264(CONCAT428(local_700,
                                        CONCAT424(local_700,
                                                  CONCAT420(local_700,
                                                            CONCAT416(local_700,
                                                                      CONCAT412(local_700,
                                                                                CONCAT48(local_700,
                                                                                         CONCAT44(
                                                  local_700,local_700))))))));
          auVar199 = ZEXT3264(local_780);
        }
        else {
          auVar155 = vsubps_avx(ZEXT1632(auVar13),auVar223);
          auVar201 = vfmadd213ps_fma(auVar155,local_580,auVar223);
          fVar142 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar34._4_4_ = (auVar201._4_4_ + auVar201._4_4_) * fVar142;
          auVar34._0_4_ = (auVar201._0_4_ + auVar201._0_4_) * fVar142;
          auVar34._8_4_ = (auVar201._8_4_ + auVar201._8_4_) * fVar142;
          auVar34._12_4_ = (auVar201._12_4_ + auVar201._12_4_) * fVar142;
          auVar34._16_4_ = fVar142 * 0.0;
          auVar34._20_4_ = fVar142 * 0.0;
          auVar34._24_4_ = fVar142 * 0.0;
          auVar34._28_4_ = 0;
          auVar155 = vcmpps_avx(local_5a0,auVar34,6);
          auVar166 = auVar160 & auVar155;
          auVar192 = ZEXT3264(CONCAT428(local_700,
                                        CONCAT424(local_700,
                                                  CONCAT420(local_700,
                                                            CONCAT416(local_700,
                                                                      CONCAT412(local_700,
                                                                                CONCAT48(local_700,
                                                                                         CONCAT44(
                                                  local_700,local_700))))))));
          auVar199 = ZEXT3264(local_780);
          auVar110 = local_5a0;
          auVar134 = local_580;
          if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar166 >> 0x7f,0) != '\0') ||
                (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar166 >> 0xbf,0) != '\0') ||
              (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar166[0x1f] < '\0') {
            local_2e0 = vandps_avx(auVar155,auVar160);
            auVar135._8_4_ = 0xbf800000;
            auVar135._0_8_ = 0xbf800000bf800000;
            auVar135._12_4_ = 0xbf800000;
            auVar135._16_4_ = 0xbf800000;
            auVar135._20_4_ = 0xbf800000;
            auVar135._24_4_ = 0xbf800000;
            auVar135._28_4_ = 0xbf800000;
            auVar158._8_4_ = 0x40000000;
            auVar158._0_8_ = 0x4000000040000000;
            auVar158._12_4_ = 0x40000000;
            auVar158._16_4_ = 0x40000000;
            auVar158._20_4_ = 0x40000000;
            auVar158._24_4_ = 0x40000000;
            auVar158._28_4_ = 0x40000000;
            auVar201 = vfmadd213ps_fma(local_240,auVar158,auVar135);
            auVar170 = ZEXT1664(auVar201);
            local_3a0 = local_580;
            local_240 = ZEXT1632(auVar201);
            auVar160 = local_240;
            local_380 = ZEXT1632(auVar201);
            local_360 = local_5a0;
            local_340 = 0;
            local_33c = iVar8;
            local_330 = local_760._0_8_;
            uStack_328 = local_760._8_8_;
            local_320 = local_680._0_8_;
            uStack_318 = local_680._8_8_;
            local_310 = local_690._0_8_;
            uStack_308 = local_690._8_8_;
            local_300 = local_610;
            uStack_2f8 = uStack_608;
            local_240 = auVar160;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar142 = 1.0 / auVar105._0_4_;
              local_2c0[0] = fVar142 * (auVar210._0_4_ + 0.0);
              local_2c0[1] = fVar142 * (auVar210._4_4_ + 1.0);
              local_2c0[2] = fVar142 * (auVar210._8_4_ + 2.0);
              local_2c0[3] = fVar142 * (auVar210._12_4_ + 3.0);
              fStack_2b0 = fVar142 * (auVar210._16_4_ + 4.0);
              fStack_2ac = fVar142 * (auVar210._20_4_ + 5.0);
              fStack_2a8 = fVar142 * (auVar210._24_4_ + 6.0);
              fStack_2a4 = auVar210._28_4_ + 7.0;
              local_240._0_8_ = auVar201._0_8_;
              local_240._8_8_ = auVar201._8_8_;
              local_2a0 = local_240._0_8_;
              uStack_298 = local_240._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = local_5a0;
              auVar136._8_4_ = 0x7f800000;
              auVar136._0_8_ = 0x7f8000007f800000;
              auVar136._12_4_ = 0x7f800000;
              auVar136._16_4_ = 0x7f800000;
              auVar136._20_4_ = 0x7f800000;
              auVar136._24_4_ = 0x7f800000;
              auVar136._28_4_ = 0x7f800000;
              auVar160 = vblendvps_avx(auVar136,local_5a0,local_2e0);
              auVar155 = vshufps_avx(auVar160,auVar160,0xb1);
              auVar155 = vminps_avx(auVar160,auVar155);
              auVar166 = vshufpd_avx(auVar155,auVar155,5);
              auVar155 = vminps_avx(auVar155,auVar166);
              auVar166 = vpermpd_avx2(auVar155,0x4e);
              auVar155 = vminps_avx(auVar155,auVar166);
              auVar155 = vcmpps_avx(auVar160,auVar155,0);
              auVar166 = local_2e0 & auVar155;
              auVar160 = local_2e0;
              if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar166 >> 0x7f,0) != '\0') ||
                    (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar166 >> 0xbf,0) != '\0') ||
                  (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar166[0x1f] < '\0') {
                auVar160 = vandps_avx(auVar155,local_2e0);
              }
              uVar90 = vmovmskps_avx(auVar160);
              uVar93 = 0;
              for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                uVar93 = uVar93 + 1;
              }
              uVar91 = (ulong)uVar93;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar142 = local_2c0[uVar91];
                uVar121 = *(undefined4 *)((long)&local_2a0 + uVar91 * 4);
                fVar116 = 1.0 - fVar142;
                fVar114 = fVar116 * fVar116 * -3.0;
                auVar201 = vfmadd231ss_fma(ZEXT416((uint)(fVar116 * fVar116)),
                                           ZEXT416((uint)(fVar142 * fVar116)),ZEXT416(0xc0000000));
                auVar11 = vfmsub132ss_fma(ZEXT416((uint)(fVar142 * fVar116)),
                                          ZEXT416((uint)(fVar142 * fVar142)),ZEXT416(0x40000000));
                fVar116 = auVar201._0_4_ * 3.0;
                fVar117 = auVar11._0_4_ * 3.0;
                fVar118 = fVar142 * fVar142 * 3.0;
                auVar179._0_4_ = fVar118 * (float)local_610._0_4_;
                auVar179._4_4_ = fVar118 * (float)local_610._4_4_;
                auVar179._8_4_ = fVar118 * (float)uStack_608;
                auVar179._12_4_ = fVar118 * uStack_608._4_4_;
                auVar147._4_4_ = fVar117;
                auVar147._0_4_ = fVar117;
                auVar147._8_4_ = fVar117;
                auVar147._12_4_ = fVar117;
                auVar201 = vfmadd132ps_fma(auVar147,auVar179,local_690);
                auVar164._4_4_ = fVar116;
                auVar164._0_4_ = fVar116;
                auVar164._8_4_ = fVar116;
                auVar164._12_4_ = fVar116;
                auVar201 = vfmadd132ps_fma(auVar164,auVar201,local_680);
                auVar148._4_4_ = fVar114;
                auVar148._0_4_ = fVar114;
                auVar148._8_4_ = fVar114;
                auVar148._12_4_ = fVar114;
                auVar201 = vfmadd132ps_fma(auVar148,auVar201,local_760);
                auVar170 = ZEXT464(*(uint *)(local_280 + uVar91 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_280 + uVar91 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar201._0_4_;
                uVar194 = vextractps_avx(auVar201,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar194;
                uVar194 = vextractps_avx(auVar201,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar194;
                *(float *)(ray + k * 4 + 0xf0) = fVar142;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar121;
                *(uint *)(ray + k * 4 + 0x110) = uVar7;
                *(undefined4 *)(ray + k * 4 + 0x120) = local_820._4_4_;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_820._0_4_ = local_820._4_4_;
                local_820._8_4_ = local_820._4_4_;
                local_820._12_4_ = local_820._4_4_;
                local_640 = (undefined1  [8])CONCAT44(uVar7,uVar7);
                _local_640 = ZEXT1632(CONCAT412(uVar7,CONCAT48(uVar7,local_640)));
                local_660 = ZEXT1632(local_680);
                local_4c0 = ZEXT1632(local_690);
                _local_5e0 = ZEXT1632(_local_610);
                _local_4e0 = ZEXT1632(*local_668);
                local_560 = local_2e0;
                do {
                  local_6e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_400 = local_2c0[uVar91];
                  uVar121 = *(undefined4 *)((long)&local_2a0 + uVar91 * 4);
                  auVar127._4_4_ = uVar121;
                  auVar127._0_4_ = uVar121;
                  auVar127._8_4_ = uVar121;
                  auVar127._12_4_ = uVar121;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar91 * 4);
                  fVar116 = 1.0 - local_400;
                  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar116 * fVar116)),
                                            ZEXT416((uint)(local_400 * fVar116)),ZEXT416(0xc0000000)
                                           );
                  auVar201 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar116)),
                                             ZEXT416((uint)(local_400 * local_400)),
                                             ZEXT416(0x40000000));
                  fVar142 = auVar201._0_4_ * 3.0;
                  fVar114 = local_400 * local_400 * 3.0;
                  auVar182._0_4_ = fVar114 * (float)local_5e0._0_4_;
                  auVar182._4_4_ = fVar114 * (float)local_5e0._4_4_;
                  auVar182._8_4_ = fVar114 * fStack_5d8;
                  auVar182._12_4_ = fVar114 * fStack_5d4;
                  auVar153._4_4_ = fVar142;
                  auVar153._0_4_ = fVar142;
                  auVar153._8_4_ = fVar142;
                  auVar153._12_4_ = fVar142;
                  auVar201 = vfmadd132ps_fma(auVar153,auVar182,local_4c0._0_16_);
                  fVar142 = auVar11._0_4_ * 3.0;
                  auVar174._4_4_ = fVar142;
                  auVar174._0_4_ = fVar142;
                  auVar174._8_4_ = fVar142;
                  auVar174._12_4_ = fVar142;
                  auVar201 = vfmadd132ps_fma(auVar174,auVar201,local_660._0_16_);
                  fVar142 = fVar116 * fVar116 * -3.0;
                  local_750.context = context->user;
                  auVar154._4_4_ = fVar142;
                  auVar154._0_4_ = fVar142;
                  auVar154._8_4_ = fVar142;
                  auVar154._12_4_ = fVar142;
                  auVar201 = vfmadd132ps_fma(auVar154,auVar201,local_760);
                  local_430 = auVar201._0_4_;
                  uStack_42c = local_430;
                  uStack_428 = local_430;
                  uStack_424 = local_430;
                  local_420 = vshufps_avx(auVar201,auVar201,0x55);
                  auVar170 = ZEXT1664(local_420);
                  local_410 = vshufps_avx(auVar201,auVar201,0xaa);
                  fStack_3fc = local_400;
                  fStack_3f8 = local_400;
                  fStack_3f4 = local_400;
                  local_3f0 = auVar127;
                  local_3e0 = local_640;
                  uStack_3d8 = uStack_638;
                  local_3d0 = local_820;
                  vpcmpeqd_avx2(ZEXT1632(local_820),ZEXT1632(local_820));
                  uStack_3bc = (local_750.context)->instID[0];
                  local_3c0 = uStack_3bc;
                  uStack_3b8 = uStack_3bc;
                  uStack_3b4 = uStack_3bc;
                  uStack_3b0 = (local_750.context)->instPrimID[0];
                  uStack_3ac = uStack_3b0;
                  uStack_3a8 = uStack_3b0;
                  uStack_3a4 = uStack_3b0;
                  local_7d0 = local_4e0;
                  uStack_7c8 = uStack_4d8;
                  local_750.valid = (int *)&local_7d0;
                  local_750.geometryUserPtr = pGVar9->userPtr;
                  local_750.hit = (RTCHitN *)&local_430;
                  local_750.N = 4;
                  local_750.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar170 = ZEXT1664(local_420);
                    (*pGVar9->intersectionFilterN)(&local_750);
                    auVar220._8_56_ = extraout_var;
                    auVar220._0_8_ = extraout_XMM1_Qa;
                    auVar127 = auVar220._0_16_;
                    auVar220 = ZEXT3264(_local_600);
                    auVar199 = ZEXT3264(local_780);
                    auVar192 = ZEXT3264(CONCAT428(fStack_6e4,
                                                  CONCAT424(fStack_6e8,
                                                            CONCAT420(fStack_6ec,
                                                                      CONCAT416(fStack_6f0,
                                                                                CONCAT412(fStack_6f4
                                                                                          ,CONCAT48(
                                                  fStack_6f8,CONCAT44(fStack_6fc,local_700))))))));
                    auVar229 = ZEXT3264(local_7c0);
                    auVar141 = ZEXT3264(local_5a0);
                    auVar210 = ZEXT3264(local_580);
                    fVar113 = (float)local_7a0;
                    fVar115 = local_7a0._4_4_;
                    fVar224 = (float)uStack_798;
                    fVar230 = uStack_798._4_4_;
                    fVar231 = (float)uStack_790;
                    fVar232 = uStack_790._4_4_;
                    fVar233 = (float)uStack_788;
                    fVar234 = uStack_788._4_4_;
                  }
                  auVar85._8_8_ = uStack_7c8;
                  auVar85._0_8_ = local_7d0;
                  if (auVar85 == (undefined1  [16])0x0) {
                    auVar201 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar11 = vpcmpeqd_avx(auVar127,auVar127);
                    auVar201 = auVar201 ^ auVar11;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    auVar201 = vpcmpeqd_avx(auVar170._0_16_,auVar170._0_16_);
                    auVar170 = ZEXT1664(auVar201);
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_750);
                      auVar220 = ZEXT3264(_local_600);
                      auVar199 = ZEXT3264(local_780);
                      auVar192 = ZEXT3264(CONCAT428(fStack_6e4,
                                                    CONCAT424(fStack_6e8,
                                                              CONCAT420(fStack_6ec,
                                                                        CONCAT416(fStack_6f0,
                                                                                  CONCAT412(
                                                  fStack_6f4,
                                                  CONCAT48(fStack_6f8,CONCAT44(fStack_6fc,local_700)
                                                          )))))));
                      auVar229 = ZEXT3264(local_7c0);
                      auVar141 = ZEXT3264(local_5a0);
                      auVar210 = ZEXT3264(local_580);
                      auVar201 = vpcmpeqd_avx(auVar201,auVar201);
                      auVar170 = ZEXT1664(auVar201);
                      fVar113 = (float)local_7a0;
                      fVar115 = local_7a0._4_4_;
                      fVar224 = (float)uStack_798;
                      fVar230 = uStack_798._4_4_;
                      fVar231 = (float)uStack_790;
                      fVar232 = uStack_790._4_4_;
                      fVar233 = (float)uStack_788;
                      fVar234 = uStack_788._4_4_;
                    }
                    auVar86._8_8_ = uStack_7c8;
                    auVar86._0_8_ = local_7d0;
                    auVar11 = vpcmpeqd_avx(auVar86,_DAT_01feba10);
                    auVar201 = auVar11 ^ auVar170._0_16_;
                    if (auVar86 != (undefined1  [16])0x0) {
                      auVar11 = auVar11 ^ auVar170._0_16_;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])local_750.hit);
                      *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar12;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar12;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar12;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar12;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar12;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar12;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar12;
                      auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar12;
                      auVar11 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])(local_750.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar11;
                    }
                  }
                  auVar110 = auVar141._0_32_;
                  auVar128._8_8_ = 0x100000001;
                  auVar128._0_8_ = 0x100000001;
                  if ((auVar128 & auVar201) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_6e0._0_4_;
                  }
                  *(undefined4 *)(local_560 + uVar91 * 4) = 0;
                  uVar121 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar112._4_4_ = uVar121;
                  auVar112._0_4_ = uVar121;
                  auVar112._8_4_ = uVar121;
                  auVar112._12_4_ = uVar121;
                  auVar112._16_4_ = uVar121;
                  auVar112._20_4_ = uVar121;
                  auVar112._24_4_ = uVar121;
                  auVar112._28_4_ = uVar121;
                  auVar155 = vcmpps_avx(auVar110,auVar112,2);
                  auVar160 = vandps_avx(auVar155,local_560);
                  local_560 = local_560 & auVar155;
                  bVar72 = (local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar73 = (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar71 = (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar70 = SUB321(local_560 >> 0x7f,0) != '\0';
                  bVar69 = (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar68 = SUB321(local_560 >> 0xbf,0) != '\0';
                  bVar66 = (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar65 = local_560[0x1f] < '\0';
                  if (((((((bVar72 || bVar73) || bVar71) || bVar70) || bVar69) || bVar68) || bVar66)
                      || bVar65) {
                    auVar140._8_4_ = 0x7f800000;
                    auVar140._0_8_ = 0x7f8000007f800000;
                    auVar140._12_4_ = 0x7f800000;
                    auVar140._16_4_ = 0x7f800000;
                    auVar140._20_4_ = 0x7f800000;
                    auVar140._24_4_ = 0x7f800000;
                    auVar140._28_4_ = 0x7f800000;
                    auVar155 = vblendvps_avx(auVar140,auVar110,auVar160);
                    auVar166 = vshufps_avx(auVar155,auVar155,0xb1);
                    auVar166 = vminps_avx(auVar155,auVar166);
                    auVar134 = vshufpd_avx(auVar166,auVar166,5);
                    auVar166 = vminps_avx(auVar166,auVar134);
                    auVar134 = vpermpd_avx2(auVar166,0x4e);
                    auVar170 = ZEXT3264(auVar134);
                    auVar166 = vminps_avx(auVar166,auVar134);
                    auVar166 = vcmpps_avx(auVar155,auVar166,0);
                    auVar134 = auVar160 & auVar166;
                    auVar155 = auVar160;
                    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar134 >> 0x7f,0) != '\0') ||
                          (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar134 >> 0xbf,0) != '\0') ||
                        (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar134[0x1f] < '\0') {
                      auVar155 = vandps_avx(auVar166,auVar160);
                    }
                    uVar90 = vmovmskps_avx(auVar155);
                    uVar93 = 0;
                    for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                      uVar93 = uVar93 + 1;
                    }
                    uVar91 = (ulong)uVar93;
                  }
                  local_560 = auVar160;
                  auVar134 = auVar210._0_32_;
                } while (((((((bVar72 || bVar73) || bVar71) || bVar70) || bVar69) || bVar68) ||
                         bVar66) || bVar65);
              }
            }
          }
          local_580 = auVar134;
          local_5a0 = auVar110;
          auVar141 = ZEXT3264(local_6c0);
        }
      }
      auVar160 = local_220;
      if (8 < iVar8) {
        _local_600 = auVar220._0_32_;
        local_1a0._4_4_ = iVar8;
        local_1a0._0_4_ = iVar8;
        local_1a0._8_4_ = iVar8;
        local_1a0._12_4_ = iVar8;
        local_1a0._16_4_ = iVar8;
        local_1a0._20_4_ = iVar8;
        local_1a0._24_4_ = iVar8;
        local_1a0._28_4_ = iVar8;
        local_1e0 = fVar143;
        fStack_1dc = fVar143;
        fStack_1d8 = fVar143;
        fStack_1d4 = fVar143;
        fStack_1d0 = fVar143;
        fStack_1cc = fVar143;
        fStack_1c8 = fVar143;
        fStack_1c4 = fVar143;
        local_200._4_4_ = local_720._0_4_;
        local_200._0_4_ = local_720._0_4_;
        local_200._8_4_ = local_720._0_4_;
        local_200._12_4_ = local_720._0_4_;
        local_200._16_4_ = local_720._0_4_;
        local_200._20_4_ = local_720._0_4_;
        local_200._24_4_ = local_720._0_4_;
        local_200._28_4_ = local_720._0_4_;
        fStack_450 = 1.0 / local_460;
        auStack_45c._0_4_ = fStack_450;
        local_460 = fStack_450;
        auStack_45c._4_4_ = fStack_450;
        fStack_454 = fStack_450;
        local_220._4_4_ = local_820._4_4_;
        local_220._0_4_ = local_820._4_4_;
        local_220._8_4_ = local_820._4_4_;
        local_220._16_16_ = auVar160._16_16_;
        local_220._12_4_ = local_820._4_4_;
        local_150 = uVar7;
        uStack_14c = uVar7;
        uStack_148 = uVar7;
        uStack_144 = uVar7;
        lVar92 = 8;
        fStack_44c = fStack_450;
        fStack_448 = fStack_450;
        fStack_444 = fStack_450;
        do {
          auVar14 = local_680;
          auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 * 4 + lVar17);
          auVar155 = *(undefined1 (*) [32])(lVar17 + 0x2227768 + lVar92 * 4);
          auVar166 = *(undefined1 (*) [32])(lVar17 + 0x2227bec + lVar92 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar17 + 0x2228070 + lVar92 * 4);
          fVar118 = *(float *)*pauVar1;
          fVar119 = *(float *)(*pauVar1 + 4);
          fVar120 = *(float *)(*pauVar1 + 8);
          fVar215 = *(float *)(*pauVar1 + 0xc);
          fVar222 = *(float *)(*pauVar1 + 0x10);
          fVar74 = *(float *)(*pauVar1 + 0x14);
          fVar75 = *(float *)(*pauVar1 + 0x18);
          auVar88 = *(undefined1 (*) [28])*pauVar1;
          auVar221._0_4_ = auVar192._0_4_ * fVar118;
          auVar221._4_4_ = auVar192._4_4_ * fVar119;
          auVar221._8_4_ = auVar192._8_4_ * fVar120;
          auVar221._12_4_ = auVar192._12_4_ * fVar215;
          auVar221._16_4_ = auVar192._16_4_ * fVar222;
          auVar221._20_4_ = auVar192._20_4_ * fVar74;
          auVar221._28_36_ = auVar220._28_36_;
          auVar221._24_4_ = auVar192._24_4_ * fVar75;
          auVar210._0_4_ = fVar113 * fVar118;
          auVar210._4_4_ = fVar115 * fVar119;
          auVar210._8_4_ = fVar224 * fVar120;
          auVar210._12_4_ = fVar230 * fVar215;
          auVar210._16_4_ = fVar231 * fVar222;
          auVar210._20_4_ = fVar232 * fVar74;
          auVar210._28_36_ = auVar170._28_36_;
          auVar210._24_4_ = fVar233 * fVar75;
          auVar201 = vfmadd231ps_fma(auVar221._0_32_,auVar166,auVar229._0_32_);
          auVar11 = vfmadd231ps_fma(auVar210._0_32_,auVar166,auVar141._0_32_);
          auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar155,auVar187);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar155,local_4a0);
          auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar160,auVar199._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar160,local_500);
          auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 * 4 + lVar17);
          auVar134 = *(undefined1 (*) [32])(lVar17 + 0x2229b88 + lVar92 * 4);
          auVar207 = *(undefined1 (*) [32])(lVar17 + 0x222a00c + lVar92 * 4);
          pfVar2 = (float *)(lVar17 + 0x222a490 + lVar92 * 4);
          fVar76 = *pfVar2;
          fVar77 = pfVar2[1];
          fVar78 = pfVar2[2];
          fVar79 = pfVar2[3];
          fVar80 = pfVar2[4];
          fVar81 = pfVar2[5];
          fVar82 = pfVar2[6];
          auVar193._0_4_ = fVar76 * auVar192._0_4_;
          auVar193._4_4_ = fVar77 * auVar192._4_4_;
          auVar193._8_4_ = fVar78 * auVar192._8_4_;
          auVar193._12_4_ = fVar79 * auVar192._12_4_;
          auVar193._16_4_ = fVar80 * auVar192._16_4_;
          auVar193._20_4_ = fVar81 * auVar192._20_4_;
          auVar193._28_36_ = auVar192._28_36_;
          auVar193._24_4_ = fVar82 * auVar192._24_4_;
          auVar35._4_4_ = fVar77 * fVar115;
          auVar35._0_4_ = fVar76 * fVar113;
          auVar35._8_4_ = fVar78 * fVar224;
          auVar35._12_4_ = fVar79 * fVar230;
          auVar35._16_4_ = fVar80 * fVar231;
          auVar35._20_4_ = fVar81 * fVar232;
          auVar35._24_4_ = fVar82 * fVar233;
          auVar35._28_4_ = fVar234;
          auVar12 = vfmadd231ps_fma(auVar193._0_32_,auVar207,auVar229._0_32_);
          auVar13 = vfmadd231ps_fma(auVar35,auVar207,auVar141._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar134,auVar187);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,local_4a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar110,auVar199._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar110,local_500);
          auVar217 = ZEXT1632(auVar201);
          _local_5e0 = vsubps_avx(ZEXT1632(auVar12),auVar217);
          local_720 = ZEXT1632(auVar13);
          auVar168 = ZEXT1632(auVar11);
          local_4c0 = vsubps_avx(local_720,auVar168);
          auVar67._4_4_ = auVar11._4_4_ * local_5e0._4_4_;
          auVar67._0_4_ = auVar11._0_4_ * local_5e0._0_4_;
          auVar67._8_4_ = auVar11._8_4_ * local_5e0._8_4_;
          auVar67._12_4_ = auVar11._12_4_ * local_5e0._12_4_;
          auVar67._16_4_ = local_5e0._16_4_ * 0.0;
          auVar67._20_4_ = local_5e0._20_4_ * 0.0;
          auVar67._24_4_ = local_5e0._24_4_ * 0.0;
          auVar67._28_4_ = local_500._28_4_;
          fVar143 = local_4c0._0_4_;
          auVar170._0_4_ = auVar201._0_4_ * fVar143;
          fVar113 = local_4c0._4_4_;
          auVar170._4_4_ = auVar201._4_4_ * fVar113;
          fVar115 = local_4c0._8_4_;
          auVar170._8_4_ = auVar201._8_4_ * fVar115;
          fVar142 = local_4c0._12_4_;
          auVar170._12_4_ = auVar201._12_4_ * fVar142;
          fVar114 = local_4c0._16_4_;
          auVar170._16_4_ = fVar114 * 0.0;
          fVar116 = local_4c0._20_4_;
          auVar170._20_4_ = fVar116 * 0.0;
          fVar117 = local_4c0._24_4_;
          auVar170._28_36_ = auVar141._28_36_;
          auVar170._24_4_ = fVar117 * 0.0;
          auVar220 = ZEXT3264(auVar166);
          auVar104 = vsubps_avx(auVar67,auVar170._0_32_);
          auVar159._0_4_ = (float)local_100._0_4_ * fVar118;
          auVar159._4_4_ = (float)local_100._4_4_ * fVar119;
          auVar159._8_4_ = fStack_f8 * fVar120;
          auVar159._12_4_ = fStack_f4 * fVar215;
          auVar159._16_4_ = fStack_f0 * fVar222;
          auVar159._20_4_ = fStack_ec * fVar74;
          auVar159._24_4_ = fStack_e8 * fVar75;
          auVar159._28_4_ = 0;
          auVar201 = vfmadd231ps_fma(auVar159,auVar166,local_a0);
          auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),local_80,auVar155);
          auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),local_e0,auVar160);
          auVar36._4_4_ = fVar77 * (float)local_100._4_4_;
          auVar36._0_4_ = fVar76 * (float)local_100._0_4_;
          auVar36._8_4_ = fVar78 * fStack_f8;
          auVar36._12_4_ = fVar79 * fStack_f4;
          auVar36._16_4_ = fVar80 * fStack_f0;
          auVar36._20_4_ = fVar81 * fStack_ec;
          auVar36._24_4_ = fVar82 * fStack_e8;
          auVar36._28_4_ = uStack_e4;
          auVar11 = vfmadd231ps_fma(auVar36,auVar207,local_a0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_80);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar110,local_e0);
          auVar37._4_4_ = fVar113 * fVar113;
          auVar37._0_4_ = fVar143 * fVar143;
          auVar37._8_4_ = fVar115 * fVar115;
          auVar37._12_4_ = fVar142 * fVar142;
          auVar37._16_4_ = fVar114 * fVar114;
          auVar37._20_4_ = fVar116 * fVar116;
          auVar37._24_4_ = fVar117 * fVar117;
          auVar37._28_4_ = local_e0._28_4_;
          auVar13 = vfmadd231ps_fma(auVar37,_local_5e0,_local_5e0);
          local_6e0 = ZEXT1632(auVar11);
          auVar203 = vmaxps_avx(ZEXT1632(auVar201),local_6e0);
          auVar204._0_4_ = auVar203._0_4_ * auVar203._0_4_ * auVar13._0_4_;
          auVar204._4_4_ = auVar203._4_4_ * auVar203._4_4_ * auVar13._4_4_;
          auVar204._8_4_ = auVar203._8_4_ * auVar203._8_4_ * auVar13._8_4_;
          auVar204._12_4_ = auVar203._12_4_ * auVar203._12_4_ * auVar13._12_4_;
          auVar204._16_4_ = auVar203._16_4_ * auVar203._16_4_ * 0.0;
          auVar204._20_4_ = auVar203._20_4_ * auVar203._20_4_ * 0.0;
          auVar204._24_4_ = auVar203._24_4_ * auVar203._24_4_ * 0.0;
          auVar204._28_4_ = 0;
          auVar38._4_4_ = auVar104._4_4_ * auVar104._4_4_;
          auVar38._0_4_ = auVar104._0_4_ * auVar104._0_4_;
          auVar38._8_4_ = auVar104._8_4_ * auVar104._8_4_;
          auVar38._12_4_ = auVar104._12_4_ * auVar104._12_4_;
          auVar38._16_4_ = auVar104._16_4_ * auVar104._16_4_;
          auVar38._20_4_ = auVar104._20_4_ * auVar104._20_4_;
          auVar38._24_4_ = auVar104._24_4_ * auVar104._24_4_;
          auVar38._28_4_ = auVar104._28_4_;
          auVar203 = vcmpps_avx(auVar38,auVar204,2);
          auVar170 = ZEXT3264(auVar203);
          local_340 = (int)lVar92;
          auVar205._4_4_ = local_340;
          auVar205._0_4_ = local_340;
          auVar205._8_4_ = local_340;
          auVar205._12_4_ = local_340;
          auVar205._16_4_ = local_340;
          auVar205._20_4_ = local_340;
          auVar205._24_4_ = local_340;
          auVar205._28_4_ = local_340;
          auVar104 = vpor_avx2(auVar205,_DAT_0205a920);
          auVar16 = vpcmpgtd_avx2(local_1a0,auVar104);
          auVar104 = auVar16 & auVar203;
          fVar113 = (float)local_7a0;
          fVar115 = local_7a0._4_4_;
          fVar224 = (float)uStack_798;
          fVar230 = uStack_798._4_4_;
          fVar231 = (float)uStack_790;
          fVar232 = uStack_790._4_4_;
          fVar233 = (float)uStack_788;
          fVar234 = uStack_788._4_4_;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar104 >> 0x7f,0) == '\0') &&
                (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar104 >> 0xbf,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar104[0x1f]) {
LAB_0169db4f:
            auVar229 = ZEXT3264(local_7c0);
            auVar192 = ZEXT3264(CONCAT428(fStack_6e4,
                                          CONCAT424(fStack_6e8,
                                                    CONCAT420(fStack_6ec,
                                                              CONCAT416(fStack_6f0,
                                                                        CONCAT412(fStack_6f4,
                                                                                  CONCAT48(
                                                  fStack_6f8,CONCAT44(fStack_6fc,local_700))))))));
            auVar199 = ZEXT3264(local_780);
          }
          else {
            local_1c0 = vandps_avx(auVar16,auVar203);
            auVar39._4_4_ = (float)local_600._4_4_ * fVar77;
            auVar39._0_4_ = (float)local_600._0_4_ * fVar76;
            auVar39._8_4_ = fStack_5f8 * fVar78;
            auVar39._12_4_ = fStack_5f4 * fVar79;
            auVar39._16_4_ = fStack_5f0 * fVar80;
            auVar39._20_4_ = fStack_5ec * fVar81;
            auVar39._24_4_ = fStack_5e8 * fVar82;
            auVar39._28_4_ = auVar203._28_4_;
            auVar11 = vfmadd213ps_fma(auVar207,local_180,auVar39);
            auVar11 = vfmadd213ps_fma(auVar134,local_120,ZEXT1632(auVar11));
            auVar11 = vfmadd132ps_fma(auVar110,ZEXT1632(auVar11),local_5c0);
            local_4e0._0_4_ = auVar88._0_4_;
            local_4e0._4_4_ = auVar88._4_4_;
            uStack_4d8._0_4_ = auVar88._8_4_;
            uStack_4d8._4_4_ = auVar88._12_4_;
            fStack_4d0 = auVar88._16_4_;
            fStack_4cc = auVar88._20_4_;
            fStack_4c8 = auVar88._24_4_;
            auVar40._4_4_ = (float)local_600._4_4_ * (float)local_4e0._4_4_;
            auVar40._0_4_ = (float)local_600._0_4_ * (float)local_4e0._0_4_;
            auVar40._8_4_ = fStack_5f8 * (float)uStack_4d8;
            auVar40._12_4_ = fStack_5f4 * uStack_4d8._4_4_;
            auVar40._16_4_ = fStack_5f0 * fStack_4d0;
            auVar40._20_4_ = fStack_5ec * fStack_4cc;
            auVar40._24_4_ = fStack_5e8 * fStack_4c8;
            auVar40._28_4_ = auVar203._28_4_;
            auVar13 = vfmadd213ps_fma(auVar166,local_180,auVar40);
            auVar13 = vfmadd213ps_fma(auVar155,local_120,ZEXT1632(auVar13));
            auVar155 = *(undefined1 (*) [32])(lVar17 + 0x22284f4 + lVar92 * 4);
            auVar166 = *(undefined1 (*) [32])(lVar17 + 0x2228978 + lVar92 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar17 + 0x2228dfc + lVar92 * 4);
            pfVar3 = (float *)(lVar17 + 0x2229280 + lVar92 * 4);
            fVar143 = *pfVar3;
            fVar142 = pfVar3[1];
            fVar114 = pfVar3[2];
            fVar116 = pfVar3[3];
            fVar117 = pfVar3[4];
            fVar118 = pfVar3[5];
            fVar119 = pfVar3[6];
            auVar41._4_4_ = fVar142 * fStack_6fc;
            auVar41._0_4_ = fVar143 * local_700;
            auVar41._8_4_ = fVar114 * fStack_6f8;
            auVar41._12_4_ = fVar116 * fStack_6f4;
            auVar41._16_4_ = fVar117 * fStack_6f0;
            auVar41._20_4_ = fVar118 * fStack_6ec;
            auVar41._24_4_ = fVar119 * fStack_6e8;
            auVar41._28_4_ = pfVar2[7];
            auVar218._0_4_ = (float)local_7a0 * fVar143;
            auVar218._4_4_ = local_7a0._4_4_ * fVar142;
            auVar218._8_4_ = (float)uStack_798 * fVar114;
            auVar218._12_4_ = uStack_798._4_4_ * fVar116;
            auVar218._16_4_ = (float)uStack_790 * fVar117;
            auVar218._20_4_ = uStack_790._4_4_ * fVar118;
            auVar218._24_4_ = (float)uStack_788 * fVar119;
            auVar218._28_4_ = 0;
            auVar42._4_4_ = fVar142 * (float)local_600._4_4_;
            auVar42._0_4_ = fVar143 * (float)local_600._0_4_;
            auVar42._8_4_ = fVar114 * fStack_5f8;
            auVar42._12_4_ = fVar116 * fStack_5f4;
            auVar42._16_4_ = fVar117 * fStack_5f0;
            auVar42._20_4_ = fVar118 * fStack_5ec;
            auVar42._24_4_ = fVar119 * fStack_5e8;
            auVar42._28_4_ = pfVar3[7];
            auVar15 = vfmadd231ps_fma(auVar41,auVar110,local_7c0);
            auVar100 = vfmadd231ps_fma(auVar218,auVar110,local_6c0);
            auVar99 = vfmadd231ps_fma(auVar42,local_180,auVar110);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar166,auVar187);
            auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar166,local_4a0);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_120,auVar166);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar155,local_780);
            auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar155,local_500);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar155,local_5c0);
            pfVar2 = (float *)(lVar17 + 0x222b6a0 + lVar92 * 4);
            fVar143 = *pfVar2;
            fVar142 = pfVar2[1];
            fVar114 = pfVar2[2];
            fVar116 = pfVar2[3];
            fVar117 = pfVar2[4];
            fVar118 = pfVar2[5];
            fVar119 = pfVar2[6];
            auVar43._4_4_ = fStack_6fc * fVar142;
            auVar43._0_4_ = local_700 * fVar143;
            auVar43._8_4_ = fStack_6f8 * fVar114;
            auVar43._12_4_ = fStack_6f4 * fVar116;
            auVar43._16_4_ = fStack_6f0 * fVar117;
            auVar43._20_4_ = fStack_6ec * fVar118;
            auVar43._24_4_ = fStack_6e8 * fVar119;
            auVar43._28_4_ = local_120._28_4_;
            auVar44._4_4_ = local_7a0._4_4_ * fVar142;
            auVar44._0_4_ = (float)local_7a0 * fVar143;
            auVar44._8_4_ = (float)uStack_798 * fVar114;
            auVar44._12_4_ = uStack_798._4_4_ * fVar116;
            auVar44._16_4_ = (float)uStack_790 * fVar117;
            auVar44._20_4_ = uStack_790._4_4_ * fVar118;
            auVar44._24_4_ = (float)uStack_788 * fVar119;
            auVar44._28_4_ = uStack_788._4_4_;
            auVar45._4_4_ = fVar142 * (float)local_600._4_4_;
            auVar45._0_4_ = fVar143 * (float)local_600._0_4_;
            auVar45._8_4_ = fVar114 * fStack_5f8;
            auVar45._12_4_ = fVar116 * fStack_5f4;
            auVar45._16_4_ = fVar117 * fStack_5f0;
            auVar45._20_4_ = fVar118 * fStack_5ec;
            auVar45._24_4_ = fVar119 * fStack_5e8;
            auVar45._28_4_ = pfVar2[7];
            auVar155 = *(undefined1 (*) [32])(lVar17 + 0x222b21c + lVar92 * 4);
            auVar144 = vfmadd231ps_fma(auVar43,auVar155,local_7c0);
            auVar123 = vfmadd231ps_fma(auVar44,auVar155,local_6c0);
            auVar98 = vfmadd231ps_fma(auVar45,local_180,auVar155);
            auVar155 = *(undefined1 (*) [32])(lVar17 + 0x222ad98 + lVar92 * 4);
            auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar155,auVar187);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar155,local_4a0);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar155,local_120);
            auVar155 = *(undefined1 (*) [32])(lVar17 + 0x222a914 + lVar92 * 4);
            auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar155,local_780);
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar155,local_500);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_5c0,auVar155);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar206._16_4_ = 0x7fffffff;
            auVar206._20_4_ = 0x7fffffff;
            auVar206._24_4_ = 0x7fffffff;
            auVar206._28_4_ = 0x7fffffff;
            auVar155 = vandps_avx(ZEXT1632(auVar15),auVar206);
            auVar166 = vandps_avx(ZEXT1632(auVar100),auVar206);
            auVar166 = vmaxps_avx(auVar155,auVar166);
            auVar155 = vandps_avx(ZEXT1632(auVar99),auVar206);
            auVar155 = vmaxps_avx(auVar166,auVar155);
            auVar87._4_4_ = fStack_1dc;
            auVar87._0_4_ = local_1e0;
            auVar87._8_4_ = fStack_1d8;
            auVar87._12_4_ = fStack_1d4;
            auVar87._16_4_ = fStack_1d0;
            auVar87._20_4_ = fStack_1cc;
            auVar87._24_4_ = fStack_1c8;
            auVar87._28_4_ = fStack_1c4;
            auVar155 = vcmpps_avx(auVar155,auVar87,1);
            auVar110 = vblendvps_avx(ZEXT1632(auVar15),_local_5e0,auVar155);
            auVar134 = vblendvps_avx(ZEXT1632(auVar100),local_4c0,auVar155);
            auVar155 = vandps_avx(ZEXT1632(auVar144),auVar206);
            auVar166 = vandps_avx(ZEXT1632(auVar123),auVar206);
            auVar166 = vmaxps_avx(auVar155,auVar166);
            auVar155 = vandps_avx(auVar206,ZEXT1632(auVar98));
            auVar155 = vmaxps_avx(auVar166,auVar155);
            auVar166 = vcmpps_avx(auVar155,auVar87,1);
            auVar155 = vblendvps_avx(ZEXT1632(auVar144),_local_5e0,auVar166);
            auVar166 = vblendvps_avx(ZEXT1632(auVar123),local_4c0,auVar166);
            auVar13 = vfmadd213ps_fma(auVar160,local_5c0,ZEXT1632(auVar13));
            auVar15 = vfmadd213ps_fma(auVar110,auVar110,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar134,auVar134);
            auVar160 = vrsqrtps_avx(ZEXT1632(auVar15));
            fVar143 = auVar160._0_4_;
            fVar142 = auVar160._4_4_;
            fVar114 = auVar160._8_4_;
            fVar116 = auVar160._12_4_;
            fVar117 = auVar160._16_4_;
            fVar118 = auVar160._20_4_;
            fVar119 = auVar160._24_4_;
            auVar46._4_4_ = fVar142 * fVar142 * fVar142 * auVar15._4_4_ * -0.5;
            auVar46._0_4_ = fVar143 * fVar143 * fVar143 * auVar15._0_4_ * -0.5;
            auVar46._8_4_ = fVar114 * fVar114 * fVar114 * auVar15._8_4_ * -0.5;
            auVar46._12_4_ = fVar116 * fVar116 * fVar116 * auVar15._12_4_ * -0.5;
            auVar46._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
            auVar46._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
            auVar46._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
            auVar46._28_4_ = 0;
            auVar228._8_4_ = 0x3fc00000;
            auVar228._0_8_ = 0x3fc000003fc00000;
            auVar228._12_4_ = 0x3fc00000;
            auVar228._16_4_ = 0x3fc00000;
            auVar228._20_4_ = 0x3fc00000;
            auVar228._24_4_ = 0x3fc00000;
            auVar228._28_4_ = 0x3fc00000;
            auVar15 = vfmadd231ps_fma(auVar46,auVar228,auVar160);
            fVar143 = auVar15._0_4_;
            fVar142 = auVar15._4_4_;
            auVar47._4_4_ = auVar134._4_4_ * fVar142;
            auVar47._0_4_ = auVar134._0_4_ * fVar143;
            fVar114 = auVar15._8_4_;
            auVar47._8_4_ = auVar134._8_4_ * fVar114;
            fVar116 = auVar15._12_4_;
            auVar47._12_4_ = auVar134._12_4_ * fVar116;
            auVar47._16_4_ = auVar134._16_4_ * 0.0;
            auVar47._20_4_ = auVar134._20_4_ * 0.0;
            auVar47._24_4_ = auVar134._24_4_ * 0.0;
            auVar47._28_4_ = auVar160._28_4_;
            auVar48._4_4_ = fVar142 * -auVar110._4_4_;
            auVar48._0_4_ = fVar143 * -auVar110._0_4_;
            auVar48._8_4_ = fVar114 * -auVar110._8_4_;
            auVar48._12_4_ = fVar116 * -auVar110._12_4_;
            auVar48._16_4_ = -auVar110._16_4_ * 0.0;
            auVar48._20_4_ = -auVar110._20_4_ * 0.0;
            auVar48._24_4_ = -auVar110._24_4_ * 0.0;
            auVar48._28_4_ = auVar134._28_4_;
            auVar15 = vfmadd213ps_fma(auVar155,auVar155,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar166,auVar166);
            auVar160 = vrsqrtps_avx(ZEXT1632(auVar15));
            auVar49._28_4_ = local_5e0._28_4_;
            auVar49._0_28_ =
                 ZEXT1628(CONCAT412(fVar116 * 0.0,
                                    CONCAT48(fVar114 * 0.0,CONCAT44(fVar142 * 0.0,fVar143 * 0.0))));
            fVar143 = auVar160._0_4_;
            fVar142 = auVar160._4_4_;
            fVar114 = auVar160._8_4_;
            fVar116 = auVar160._12_4_;
            fVar117 = auVar160._16_4_;
            fVar118 = auVar160._20_4_;
            fVar119 = auVar160._24_4_;
            auVar50._4_4_ = fVar142 * fVar142 * fVar142 * auVar15._4_4_ * -0.5;
            auVar50._0_4_ = fVar143 * fVar143 * fVar143 * auVar15._0_4_ * -0.5;
            auVar50._8_4_ = fVar114 * fVar114 * fVar114 * auVar15._8_4_ * -0.5;
            auVar50._12_4_ = fVar116 * fVar116 * fVar116 * auVar15._12_4_ * -0.5;
            auVar50._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
            auVar50._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
            auVar50._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
            auVar50._28_4_ = 0;
            auVar15 = vfmadd231ps_fma(auVar50,auVar228,auVar160);
            fVar143 = auVar15._0_4_;
            fVar142 = auVar15._4_4_;
            auVar51._4_4_ = auVar166._4_4_ * fVar142;
            auVar51._0_4_ = auVar166._0_4_ * fVar143;
            fVar114 = auVar15._8_4_;
            auVar51._8_4_ = auVar166._8_4_ * fVar114;
            fVar116 = auVar15._12_4_;
            auVar51._12_4_ = auVar166._12_4_ * fVar116;
            auVar51._16_4_ = auVar166._16_4_ * 0.0;
            auVar51._20_4_ = auVar166._20_4_ * 0.0;
            auVar51._24_4_ = auVar166._24_4_ * 0.0;
            auVar51._28_4_ = 0;
            auVar52._4_4_ = fVar142 * -auVar155._4_4_;
            auVar52._0_4_ = fVar143 * -auVar155._0_4_;
            auVar52._8_4_ = fVar114 * -auVar155._8_4_;
            auVar52._12_4_ = fVar116 * -auVar155._12_4_;
            auVar52._16_4_ = -auVar155._16_4_ * 0.0;
            auVar52._20_4_ = -auVar155._20_4_ * 0.0;
            auVar52._24_4_ = -auVar155._24_4_ * 0.0;
            auVar52._28_4_ = auVar160._28_4_;
            auVar53._28_4_ = 0xbf000000;
            auVar53._0_28_ =
                 ZEXT1628(CONCAT412(fVar116 * 0.0,
                                    CONCAT48(fVar114 * 0.0,CONCAT44(fVar142 * 0.0,fVar143 * 0.0))));
            auVar15 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar201),auVar217);
            auVar160 = ZEXT1632(auVar201);
            auVar100 = vfmadd213ps_fma(auVar48,auVar160,auVar168);
            auVar99 = vfmadd213ps_fma(auVar49,auVar160,ZEXT1632(auVar13));
            auVar98 = vfnmadd213ps_fma(auVar47,auVar160,auVar217);
            auVar144 = vfmadd213ps_fma(auVar51,local_6e0,ZEXT1632(auVar12));
            auVar124 = vfnmadd213ps_fma(auVar48,auVar160,auVar168);
            auVar123 = vfmadd213ps_fma(auVar52,local_6e0,local_720);
            auVar129 = ZEXT1632(auVar201);
            auVar97 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar129,auVar49);
            auVar13 = vfmadd213ps_fma(auVar53,local_6e0,ZEXT1632(auVar11));
            auVar162 = vfnmadd213ps_fma(auVar51,local_6e0,ZEXT1632(auVar12));
            auVar172 = vfnmadd213ps_fma(auVar52,local_6e0,local_720);
            auVar122 = vfnmadd231ps_fma(ZEXT1632(auVar11),local_6e0,auVar53);
            auVar160 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar124));
            auVar155 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar97));
            auVar54._4_4_ = auVar160._4_4_ * auVar97._4_4_;
            auVar54._0_4_ = auVar160._0_4_ * auVar97._0_4_;
            auVar54._8_4_ = auVar160._8_4_ * auVar97._8_4_;
            auVar54._12_4_ = auVar160._12_4_ * auVar97._12_4_;
            auVar54._16_4_ = auVar160._16_4_ * 0.0;
            auVar54._20_4_ = auVar160._20_4_ * 0.0;
            auVar54._24_4_ = auVar160._24_4_ * 0.0;
            auVar54._28_4_ = local_5e0._28_4_;
            auVar12 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar124),auVar155);
            auVar55._4_4_ = auVar98._4_4_ * auVar155._4_4_;
            auVar55._0_4_ = auVar98._0_4_ * auVar155._0_4_;
            auVar55._8_4_ = auVar98._8_4_ * auVar155._8_4_;
            auVar55._12_4_ = auVar98._12_4_ * auVar155._12_4_;
            auVar55._16_4_ = auVar155._16_4_ * 0.0;
            auVar55._20_4_ = auVar155._20_4_ * 0.0;
            auVar55._24_4_ = auVar155._24_4_ * 0.0;
            auVar55._28_4_ = auVar155._28_4_;
            auVar207 = ZEXT1632(auVar98);
            auVar155 = vsubps_avx(ZEXT1632(auVar144),auVar207);
            auVar104 = ZEXT1632(auVar97);
            auVar11 = vfmsub231ps_fma(auVar55,auVar104,auVar155);
            auVar56._4_4_ = auVar124._4_4_ * auVar155._4_4_;
            auVar56._0_4_ = auVar124._0_4_ * auVar155._0_4_;
            auVar56._8_4_ = auVar124._8_4_ * auVar155._8_4_;
            auVar56._12_4_ = auVar124._12_4_ * auVar155._12_4_;
            auVar56._16_4_ = auVar155._16_4_ * 0.0;
            auVar56._20_4_ = auVar155._20_4_ * 0.0;
            auVar56._24_4_ = auVar155._24_4_ * 0.0;
            auVar56._28_4_ = auVar155._28_4_;
            auVar98 = vfmsub231ps_fma(auVar56,auVar207,auVar160);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar16 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,2);
            auVar160 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar15),auVar16);
            local_720 = vblendvps_avx(ZEXT1632(auVar172),ZEXT1632(auVar100),auVar16);
            auVar155 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar99),auVar16);
            auVar166 = vblendvps_avx(auVar207,ZEXT1632(auVar144),auVar16);
            auVar110 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar123),auVar16);
            auVar134 = vblendvps_avx(auVar104,ZEXT1632(auVar13),auVar16);
            auVar207 = vblendvps_avx(ZEXT1632(auVar144),auVar207,auVar16);
            auVar203 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar124),auVar16);
            auVar11 = vpackssdw_avx(local_1c0._0_16_,local_1c0._16_16_);
            auVar104 = vblendvps_avx(ZEXT1632(auVar13),auVar104,auVar16);
            auVar207 = vsubps_avx(auVar207,auVar160);
            auVar100 = auVar207._0_16_;
            auVar203 = vsubps_avx(auVar203,local_720);
            auVar168 = vsubps_avx(auVar104,auVar155);
            auVar217 = vsubps_avx(auVar160,auVar166);
            auVar103 = vsubps_avx(local_720,auVar110);
            auVar105 = vsubps_avx(auVar155,auVar134);
            auVar184._0_4_ = auVar168._0_4_ * auVar160._0_4_;
            auVar184._4_4_ = auVar168._4_4_ * auVar160._4_4_;
            auVar184._8_4_ = auVar168._8_4_ * auVar160._8_4_;
            auVar184._12_4_ = auVar168._12_4_ * auVar160._12_4_;
            auVar184._16_4_ = auVar168._16_4_ * auVar160._16_4_;
            auVar184._20_4_ = auVar168._20_4_ * auVar160._20_4_;
            auVar184._24_4_ = auVar168._24_4_ * auVar160._24_4_;
            auVar184._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar184,auVar155,auVar207);
            auVar57._4_4_ = auVar207._4_4_ * local_720._4_4_;
            auVar57._0_4_ = auVar207._0_4_ * local_720._0_4_;
            auVar57._8_4_ = auVar207._8_4_ * local_720._8_4_;
            auVar57._12_4_ = auVar207._12_4_ * local_720._12_4_;
            auVar57._16_4_ = auVar207._16_4_ * local_720._16_4_;
            auVar57._20_4_ = auVar207._20_4_ * local_720._20_4_;
            auVar57._24_4_ = auVar207._24_4_ * local_720._24_4_;
            auVar57._28_4_ = auVar104._28_4_;
            auVar13 = vfmsub231ps_fma(auVar57,auVar160,auVar203);
            auVar220 = ZEXT864(0) << 0x20;
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar185._0_4_ = auVar203._0_4_ * auVar155._0_4_;
            auVar185._4_4_ = auVar203._4_4_ * auVar155._4_4_;
            auVar185._8_4_ = auVar203._8_4_ * auVar155._8_4_;
            auVar185._12_4_ = auVar203._12_4_ * auVar155._12_4_;
            auVar185._16_4_ = auVar203._16_4_ * auVar155._16_4_;
            auVar185._20_4_ = auVar203._20_4_ * auVar155._20_4_;
            auVar185._24_4_ = auVar203._24_4_ * auVar155._24_4_;
            auVar185._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar185,local_720,auVar168);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar186._0_4_ = auVar105._0_4_ * auVar166._0_4_;
            auVar186._4_4_ = auVar105._4_4_ * auVar166._4_4_;
            auVar186._8_4_ = auVar105._8_4_ * auVar166._8_4_;
            auVar186._12_4_ = auVar105._12_4_ * auVar166._12_4_;
            auVar186._16_4_ = auVar105._16_4_ * auVar166._16_4_;
            auVar186._20_4_ = auVar105._20_4_ * auVar166._20_4_;
            auVar186._24_4_ = auVar105._24_4_ * auVar166._24_4_;
            auVar186._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar186,auVar217,auVar134);
            auVar58._4_4_ = auVar103._4_4_ * auVar134._4_4_;
            auVar58._0_4_ = auVar103._0_4_ * auVar134._0_4_;
            auVar58._8_4_ = auVar103._8_4_ * auVar134._8_4_;
            auVar58._12_4_ = auVar103._12_4_ * auVar134._12_4_;
            auVar58._16_4_ = auVar103._16_4_ * auVar134._16_4_;
            auVar58._20_4_ = auVar103._20_4_ * auVar134._20_4_;
            auVar58._24_4_ = auVar103._24_4_ * auVar134._24_4_;
            auVar58._28_4_ = auVar134._28_4_;
            auVar15 = vfmsub231ps_fma(auVar58,auVar110,auVar105);
            auVar59._4_4_ = auVar217._4_4_ * auVar110._4_4_;
            auVar59._0_4_ = auVar217._0_4_ * auVar110._0_4_;
            auVar59._8_4_ = auVar217._8_4_ * auVar110._8_4_;
            auVar59._12_4_ = auVar217._12_4_ * auVar110._12_4_;
            auVar59._16_4_ = auVar217._16_4_ * auVar110._16_4_;
            auVar59._20_4_ = auVar217._20_4_ * auVar110._20_4_;
            auVar59._24_4_ = auVar217._24_4_ * auVar110._24_4_;
            auVar59._28_4_ = auVar110._28_4_;
            auVar99 = vfmsub231ps_fma(auVar59,auVar103,auVar166);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar166 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
            auVar166 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,2);
            auVar12 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
            auVar11 = vpand_avx(auVar12,auVar11);
            auVar166 = vpmovsxwd_avx2(auVar11);
            if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar166 >> 0x7f,0) == '\0') &&
                  (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar166 >> 0xbf,0) == '\0') &&
                (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar166[0x1f]) {
LAB_0169de6b:
              auVar170 = ZEXT3264(CONCAT824(uStack_508,
                                            CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
              auVar11 = vpcmpeqd_avx(auVar100,auVar100);
              auVar141 = ZEXT1664(auVar11);
            }
            else {
              auVar60._4_4_ = auVar203._4_4_ * auVar105._4_4_;
              auVar60._0_4_ = auVar203._0_4_ * auVar105._0_4_;
              auVar60._8_4_ = auVar203._8_4_ * auVar105._8_4_;
              auVar60._12_4_ = auVar203._12_4_ * auVar105._12_4_;
              auVar60._16_4_ = auVar203._16_4_ * auVar105._16_4_;
              auVar60._20_4_ = auVar203._20_4_ * auVar105._20_4_;
              auVar60._24_4_ = auVar203._24_4_ * auVar105._24_4_;
              auVar60._28_4_ = auVar166._28_4_;
              auVar144 = vfmsub231ps_fma(auVar60,auVar103,auVar168);
              auVar188._0_4_ = auVar217._0_4_ * auVar168._0_4_;
              auVar188._4_4_ = auVar217._4_4_ * auVar168._4_4_;
              auVar188._8_4_ = auVar217._8_4_ * auVar168._8_4_;
              auVar188._12_4_ = auVar217._12_4_ * auVar168._12_4_;
              auVar188._16_4_ = auVar217._16_4_ * auVar168._16_4_;
              auVar188._20_4_ = auVar217._20_4_ * auVar168._20_4_;
              auVar188._24_4_ = auVar217._24_4_ * auVar168._24_4_;
              auVar188._28_4_ = 0;
              auVar99 = vfmsub231ps_fma(auVar188,auVar207,auVar105);
              auVar61._4_4_ = auVar207._4_4_ * auVar103._4_4_;
              auVar61._0_4_ = auVar207._0_4_ * auVar103._0_4_;
              auVar61._8_4_ = auVar207._8_4_ * auVar103._8_4_;
              auVar61._12_4_ = auVar207._12_4_ * auVar103._12_4_;
              auVar61._16_4_ = auVar207._16_4_ * auVar103._16_4_;
              auVar61._20_4_ = auVar207._20_4_ * auVar103._20_4_;
              auVar61._24_4_ = auVar207._24_4_ * auVar103._24_4_;
              auVar61._28_4_ = auVar103._28_4_;
              auVar123 = vfmsub231ps_fma(auVar61,auVar217,auVar203);
              auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar123));
              auVar100 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar144),ZEXT832(0) << 0x20);
              auVar166 = vrcpps_avx(ZEXT1632(auVar100));
              auVar219._8_4_ = 0x3f800000;
              auVar219._0_8_ = &DAT_3f8000003f800000;
              auVar219._12_4_ = 0x3f800000;
              auVar219._16_4_ = 0x3f800000;
              auVar219._20_4_ = 0x3f800000;
              auVar219._24_4_ = 0x3f800000;
              auVar219._28_4_ = 0x3f800000;
              auVar220 = ZEXT3264(auVar219);
              auVar12 = vfnmadd213ps_fma(auVar166,ZEXT1632(auVar100),auVar219);
              auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar166,auVar166);
              auVar62._4_4_ = auVar123._4_4_ * auVar155._4_4_;
              auVar62._0_4_ = auVar123._0_4_ * auVar155._0_4_;
              auVar62._8_4_ = auVar123._8_4_ * auVar155._8_4_;
              auVar62._12_4_ = auVar123._12_4_ * auVar155._12_4_;
              auVar62._16_4_ = auVar155._16_4_ * 0.0;
              auVar62._20_4_ = auVar155._20_4_ * 0.0;
              auVar62._24_4_ = auVar155._24_4_ * 0.0;
              auVar62._28_4_ = auVar155._28_4_;
              auVar99 = vfmadd231ps_fma(auVar62,ZEXT1632(auVar99),local_720);
              auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar144),auVar160);
              fVar143 = auVar12._0_4_;
              fVar142 = auVar12._4_4_;
              fVar114 = auVar12._8_4_;
              fVar116 = auVar12._12_4_;
              auVar166 = ZEXT1632(CONCAT412(fVar116 * auVar99._12_4_,
                                            CONCAT48(fVar114 * auVar99._8_4_,
                                                     CONCAT44(fVar142 * auVar99._4_4_,
                                                              fVar143 * auVar99._0_4_))));
              uVar121 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar169._4_4_ = uVar121;
              auVar169._0_4_ = uVar121;
              auVar169._8_4_ = uVar121;
              auVar169._12_4_ = uVar121;
              auVar169._16_4_ = uVar121;
              auVar169._20_4_ = uVar121;
              auVar169._24_4_ = uVar121;
              auVar169._28_4_ = uVar121;
              auVar160 = vcmpps_avx(local_200,auVar166,2);
              auVar155 = vcmpps_avx(auVar166,auVar169,2);
              auVar160 = vandps_avx(auVar155,auVar160);
              auVar12 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
              auVar11 = vpand_avx(auVar11,auVar12);
              auVar160 = vpmovsxwd_avx2(auVar11);
              if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar160 >> 0x7f,0) == '\0') &&
                    (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar160 >> 0xbf,0) == '\0') &&
                  (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar160[0x1f]) goto LAB_0169de6b;
              auVar160 = vcmpps_avx(ZEXT1632(auVar100),ZEXT832(0) << 0x20,4);
              auVar100 = auVar160._16_16_;
              auVar12 = vpackssdw_avx(auVar160._0_16_,auVar100);
              auVar11 = vpand_avx(auVar11,auVar12);
              auVar160 = vpmovsxwd_avx2(auVar11);
              auVar170 = ZEXT3264(CONCAT824(uStack_508,
                                            CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
              auVar11 = vpcmpeqd_avx(auVar100,auVar100);
              auVar141 = ZEXT1664(auVar11);
              if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar160 >> 0x7f,0) != '\0') ||
                    (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar160 >> 0xbf,0) != '\0') ||
                  (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar160[0x1f] < '\0') {
                auVar110 = ZEXT1632(CONCAT412(fVar116 * auVar13._12_4_,
                                              CONCAT48(fVar114 * auVar13._8_4_,
                                                       CONCAT44(fVar142 * auVar13._4_4_,
                                                                fVar143 * auVar13._0_4_))));
                auVar63._28_4_ = SUB84(uStack_508,4);
                auVar63._0_28_ =
                     ZEXT1628(CONCAT412(fVar116 * auVar15._12_4_,
                                        CONCAT48(fVar114 * auVar15._8_4_,
                                                 CONCAT44(fVar142 * auVar15._4_4_,
                                                          fVar143 * auVar15._0_4_))));
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = &DAT_3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar155 = vsubps_avx(auVar198,auVar110);
                local_c0 = vblendvps_avx(auVar155,auVar110,auVar16);
                auVar155 = vsubps_avx(auVar198,auVar63);
                local_260 = vblendvps_avx(auVar155,auVar63,auVar16);
                auVar170 = ZEXT3264(auVar160);
                local_480 = auVar166;
              }
            }
            auVar229 = ZEXT3264(local_7c0);
            auVar160 = auVar170._0_32_;
            if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar160 >> 0x7f,0) == '\0') &&
                  (auVar170 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar160 >> 0xbf,0) == '\0') &&
                (auVar170 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar170[0x1f]) goto LAB_0169db4f;
            auVar155 = vsubps_avx(local_6e0,auVar129);
            auVar11 = vfmadd213ps_fma(auVar155,local_c0,auVar129);
            fVar143 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar64._4_4_ = (auVar11._4_4_ + auVar11._4_4_) * fVar143;
            auVar64._0_4_ = (auVar11._0_4_ + auVar11._0_4_) * fVar143;
            auVar64._8_4_ = (auVar11._8_4_ + auVar11._8_4_) * fVar143;
            auVar64._12_4_ = (auVar11._12_4_ + auVar11._12_4_) * fVar143;
            auVar64._16_4_ = fVar143 * 0.0;
            auVar64._20_4_ = fVar143 * 0.0;
            auVar64._24_4_ = fVar143 * 0.0;
            auVar64._28_4_ = fVar143;
            auVar155 = vcmpps_avx(local_480,auVar64,6);
            auVar166 = auVar160 & auVar155;
            auVar192 = ZEXT3264(CONCAT428(fStack_6e4,
                                          CONCAT424(fStack_6e8,
                                                    CONCAT420(fStack_6ec,
                                                              CONCAT416(fStack_6f0,
                                                                        CONCAT412(fStack_6f4,
                                                                                  CONCAT48(
                                                  fStack_6f8,CONCAT44(fStack_6fc,local_700))))))));
            auVar199 = ZEXT3264(local_780);
            if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar166 >> 0x7f,0) != '\0') ||
                  (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar166 >> 0xbf,0) != '\0') ||
                (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar166[0x1f] < '\0') {
              local_2e0 = vandps_avx(auVar155,auVar160);
              auVar137._8_4_ = 0xbf800000;
              auVar137._0_8_ = 0xbf800000bf800000;
              auVar137._12_4_ = 0xbf800000;
              auVar137._16_4_ = 0xbf800000;
              auVar137._20_4_ = 0xbf800000;
              auVar137._24_4_ = 0xbf800000;
              auVar137._28_4_ = 0xbf800000;
              auVar161._8_4_ = 0x40000000;
              auVar161._0_8_ = 0x4000000040000000;
              auVar161._12_4_ = 0x40000000;
              auVar161._16_4_ = 0x40000000;
              auVar161._20_4_ = 0x40000000;
              auVar161._24_4_ = 0x40000000;
              auVar161._28_4_ = 0x40000000;
              auVar11 = vfmadd213ps_fma(local_260,auVar161,auVar137);
              auVar170 = ZEXT1664(auVar11);
              local_3a0 = local_c0;
              local_260 = ZEXT1632(auVar11);
              auVar160 = local_260;
              local_380 = ZEXT1632(auVar11);
              local_360 = local_480;
              local_33c = iVar8;
              local_330 = local_760._0_8_;
              uStack_328 = local_760._8_8_;
              local_320 = local_680._0_8_;
              uStack_318 = local_680._8_8_;
              local_310 = local_690._0_8_;
              uStack_308 = local_690._8_8_;
              local_300 = local_610;
              uStack_2f8 = uStack_608;
              pGVar9 = (context->scene->geometries).items[(uint)local_820._4_4_].ptr;
              local_260 = auVar160;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar143 = (float)local_340;
                local_2c0[0] = (fVar143 + local_c0._0_4_ + 0.0) * local_460;
                local_2c0[1] = (fVar143 + local_c0._4_4_ + 1.0) * (float)auStack_45c._0_4_;
                local_2c0[2] = (fVar143 + local_c0._8_4_ + 2.0) * (float)auStack_45c._4_4_;
                local_2c0[3] = (fVar143 + local_c0._12_4_ + 3.0) * fStack_454;
                fStack_2b0 = (fVar143 + local_c0._16_4_ + 4.0) * fStack_450;
                fStack_2ac = (fVar143 + local_c0._20_4_ + 5.0) * fStack_44c;
                fStack_2a8 = (fVar143 + local_c0._24_4_ + 6.0) * fStack_448;
                fStack_2a4 = fVar143 + local_c0._28_4_ + 7.0;
                local_260._0_8_ = auVar11._0_8_;
                local_260._8_8_ = auVar11._8_8_;
                local_2a0 = local_260._0_8_;
                uStack_298 = local_260._8_8_;
                uStack_290 = 0;
                uStack_288 = 0;
                local_280 = local_480;
                auVar138._8_4_ = 0x7f800000;
                auVar138._0_8_ = 0x7f8000007f800000;
                auVar138._12_4_ = 0x7f800000;
                auVar138._16_4_ = 0x7f800000;
                auVar138._20_4_ = 0x7f800000;
                auVar138._24_4_ = 0x7f800000;
                auVar138._28_4_ = 0x7f800000;
                auVar160 = vblendvps_avx(auVar138,local_480,local_2e0);
                auVar155 = vshufps_avx(auVar160,auVar160,0xb1);
                auVar155 = vminps_avx(auVar160,auVar155);
                auVar166 = vshufpd_avx(auVar155,auVar155,5);
                auVar155 = vminps_avx(auVar155,auVar166);
                auVar166 = vpermpd_avx2(auVar155,0x4e);
                auVar155 = vminps_avx(auVar155,auVar166);
                auVar155 = vcmpps_avx(auVar160,auVar155,0);
                auVar166 = local_2e0 & auVar155;
                auVar160 = local_2e0;
                if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar166 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar166 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar166 >> 0x7f,0) != '\0') ||
                      (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar166 >> 0xbf,0) != '\0') ||
                    (auVar166 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar166[0x1f] < '\0') {
                  auVar160 = vandps_avx(auVar155,local_2e0);
                }
                uVar90 = vmovmskps_avx(auVar160);
                uVar93 = 0;
                for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                  uVar93 = uVar93 + 1;
                }
                uVar91 = (ulong)uVar93;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar143 = local_2c0[uVar91];
                  uVar121 = *(undefined4 *)((long)&local_2a0 + uVar91 * 4);
                  fVar114 = 1.0 - fVar143;
                  fVar142 = fVar114 * fVar114 * -3.0;
                  auVar201 = vfmadd231ss_fma(ZEXT416((uint)(fVar114 * fVar114)),
                                             ZEXT416((uint)(fVar143 * fVar114)),ZEXT416(0xc0000000))
                  ;
                  auVar11 = vfmsub132ss_fma(ZEXT416((uint)(fVar143 * fVar114)),
                                            ZEXT416((uint)(fVar143 * fVar143)),ZEXT416(0x40000000));
                  fVar114 = auVar201._0_4_ * 3.0;
                  fVar116 = auVar11._0_4_ * 3.0;
                  fVar117 = fVar143 * fVar143 * 3.0;
                  auVar180._0_4_ = fVar117 * (float)local_610._0_4_;
                  auVar180._4_4_ = fVar117 * (float)local_610._4_4_;
                  auVar180._8_4_ = fVar117 * (float)uStack_608;
                  auVar180._12_4_ = fVar117 * uStack_608._4_4_;
                  auVar149._4_4_ = fVar116;
                  auVar149._0_4_ = fVar116;
                  auVar149._8_4_ = fVar116;
                  auVar149._12_4_ = fVar116;
                  auVar201 = vfmadd132ps_fma(auVar149,auVar180,local_690);
                  auVar165._4_4_ = fVar114;
                  auVar165._0_4_ = fVar114;
                  auVar165._8_4_ = fVar114;
                  auVar165._12_4_ = fVar114;
                  auVar201 = vfmadd132ps_fma(auVar165,auVar201,local_680);
                  auVar150._4_4_ = fVar142;
                  auVar150._0_4_ = fVar142;
                  auVar150._8_4_ = fVar142;
                  auVar150._12_4_ = fVar142;
                  auVar201 = vfmadd132ps_fma(auVar150,auVar201,local_760);
                  auVar170 = ZEXT464(*(uint *)(local_280 + uVar91 * 4));
                  *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_280 + uVar91 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar201._0_4_;
                  uVar194 = vextractps_avx(auVar201,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar194;
                  uVar194 = vextractps_avx(auVar201,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar194;
                  *(float *)(ray + k * 4 + 0xf0) = fVar143;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar121;
                  *(uint *)(ray + k * 4 + 0x110) = uVar7;
                  *(undefined4 *)(ray + k * 4 + 0x120) = local_820._4_4_;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_8a0 = ZEXT1632(CONCAT88(auVar201._8_8_,uVar91));
                  local_720._0_16_ = local_690;
                  _local_640 = ZEXT1632(_local_610);
                  local_660 = ZEXT1632(*local_668);
                  local_560 = local_2e0;
                  _local_4e0 = *pauVar1;
                  do {
                    auVar160 = local_8a0;
                    local_6e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_400 = local_2c0[local_8a0._0_8_];
                    local_3f0._4_4_ = *(undefined4 *)((long)&local_2a0 + local_8a0._0_8_ * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_280 + local_8a0._0_8_ * 4);
                    fVar114 = 1.0 - local_400;
                    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar114 * fVar114)),
                                              ZEXT416((uint)(local_400 * fVar114)),
                                              ZEXT416(0xc0000000));
                    auVar201 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar114)),
                                               ZEXT416((uint)(local_400 * local_400)),
                                               ZEXT416(0x40000000));
                    fVar143 = auVar201._0_4_ * 3.0;
                    fVar142 = local_400 * local_400 * 3.0;
                    auVar181._0_4_ = fVar142 * (float)local_640._0_4_;
                    auVar181._4_4_ = fVar142 * (float)local_640._4_4_;
                    auVar181._8_4_ = fVar142 * (float)uStack_638;
                    auVar181._12_4_ = fVar142 * uStack_638._4_4_;
                    auVar151._4_4_ = fVar143;
                    auVar151._0_4_ = fVar143;
                    auVar151._8_4_ = fVar143;
                    auVar151._12_4_ = fVar143;
                    auVar201 = vfmadd132ps_fma(auVar151,auVar181,local_720._0_16_);
                    fVar143 = auVar11._0_4_ * 3.0;
                    auVar173._4_4_ = fVar143;
                    auVar173._0_4_ = fVar143;
                    auVar173._8_4_ = fVar143;
                    auVar173._12_4_ = fVar143;
                    auVar201 = vfmadd132ps_fma(auVar173,auVar201,auVar14);
                    fVar143 = fVar114 * fVar114 * -3.0;
                    local_750.context = context->user;
                    auVar152._4_4_ = fVar143;
                    auVar152._0_4_ = fVar143;
                    auVar152._8_4_ = fVar143;
                    auVar152._12_4_ = fVar143;
                    auVar201 = vfmadd132ps_fma(auVar152,auVar201,local_760);
                    local_430 = auVar201._0_4_;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    local_420 = vshufps_avx(auVar201,auVar201,0x55);
                    local_410 = vshufps_avx(auVar201,auVar201,0xaa);
                    fStack_3fc = local_400;
                    fStack_3f8 = local_400;
                    fStack_3f4 = local_400;
                    local_3f0._0_4_ = local_3f0._4_4_;
                    local_3f0._8_4_ = local_3f0._4_4_;
                    local_3f0._12_4_ = local_3f0._4_4_;
                    local_3e0 = CONCAT44(uStack_14c,local_150);
                    uStack_3d8 = CONCAT44(uStack_144,uStack_148);
                    local_3d0 = local_220._0_16_;
                    vpcmpeqd_avx2(ZEXT1632(local_220._0_16_),ZEXT1632(local_220._0_16_));
                    uStack_3bc = (local_750.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_750.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_7d0 = local_660._0_8_;
                    uStack_7c8 = local_660._8_8_;
                    local_750.valid = (int *)&local_7d0;
                    local_750.geometryUserPtr = pGVar9->userPtr;
                    local_750.hit = (RTCHitN *)&local_430;
                    local_750.N = 4;
                    local_750.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar201 = auVar141._0_16_;
                      auVar220 = ZEXT1664(auVar220._0_16_);
                      (*pGVar9->intersectionFilterN)(&local_750);
                      auVar199 = ZEXT3264(local_780);
                      auVar192 = ZEXT3264(CONCAT428(fStack_6e4,
                                                    CONCAT424(fStack_6e8,
                                                              CONCAT420(fStack_6ec,
                                                                        CONCAT416(fStack_6f0,
                                                                                  CONCAT412(
                                                  fStack_6f4,
                                                  CONCAT48(fStack_6f8,CONCAT44(fStack_6fc,local_700)
                                                          )))))));
                      auVar229 = ZEXT3264(local_7c0);
                      auVar201 = vpcmpeqd_avx(auVar201,auVar201);
                      auVar141 = ZEXT1664(auVar201);
                      fVar113 = (float)local_7a0;
                      fVar115 = local_7a0._4_4_;
                      fVar224 = (float)uStack_798;
                      fVar230 = uStack_798._4_4_;
                      fVar231 = (float)uStack_790;
                      fVar232 = uStack_790._4_4_;
                      fVar233 = (float)uStack_788;
                      fVar234 = uStack_788._4_4_;
                    }
                    auVar83._8_8_ = uStack_7c8;
                    auVar83._0_8_ = local_7d0;
                    auVar201 = auVar141._0_16_;
                    if (auVar83 == (undefined1  [16])0x0) {
                      auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar201 = auVar201 ^ auVar11;
                      auVar170 = ZEXT3264(local_480);
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar220 = ZEXT1664(auVar220._0_16_);
                        (*p_Var10)(&local_750);
                        auVar199 = ZEXT3264(local_780);
                        auVar192 = ZEXT3264(CONCAT428(fStack_6e4,
                                                      CONCAT424(fStack_6e8,
                                                                CONCAT420(fStack_6ec,
                                                                          CONCAT416(fStack_6f0,
                                                                                    CONCAT412(
                                                  fStack_6f4,
                                                  CONCAT48(fStack_6f8,CONCAT44(fStack_6fc,local_700)
                                                          )))))));
                        auVar229 = ZEXT3264(local_7c0);
                        auVar201 = vpcmpeqd_avx(auVar201,auVar201);
                        auVar141 = ZEXT1664(auVar201);
                        fVar113 = (float)local_7a0;
                        fVar115 = local_7a0._4_4_;
                        fVar224 = (float)uStack_798;
                        fVar230 = uStack_798._4_4_;
                        fVar231 = (float)uStack_790;
                        fVar232 = uStack_790._4_4_;
                        fVar233 = (float)uStack_788;
                        fVar234 = uStack_788._4_4_;
                      }
                      auVar84._8_8_ = uStack_7c8;
                      auVar84._0_8_ = local_7d0;
                      auVar11 = vpcmpeqd_avx(auVar84,_DAT_01feba10);
                      auVar201 = auVar141._0_16_ ^ auVar11;
                      auVar170 = ZEXT3264(local_480);
                      if (auVar84 != (undefined1  [16])0x0) {
                        auVar11 = auVar141._0_16_ ^ auVar11;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])local_750.hit);
                        *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar12;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x10));
                        *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar12;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x20));
                        *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar12;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x30));
                        *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar12;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x40));
                        *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar12;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x50));
                        *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar12;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x60));
                        *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar12;
                        auVar12 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x70));
                        *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar12;
                        auVar11 = vmaskmovps_avx(auVar11,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x80));
                        *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar11;
                      }
                    }
                    auVar126._8_8_ = 0x100000001;
                    auVar126._0_8_ = 0x100000001;
                    if ((auVar126 & auVar201) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_6e0._0_4_;
                    }
                    *(undefined4 *)(local_560 + local_8a0._0_8_ * 4) = 0;
                    uVar121 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar111._4_4_ = uVar121;
                    auVar111._0_4_ = uVar121;
                    auVar111._8_4_ = uVar121;
                    auVar111._12_4_ = uVar121;
                    auVar111._16_4_ = uVar121;
                    auVar111._20_4_ = uVar121;
                    auVar111._24_4_ = uVar121;
                    auVar111._28_4_ = uVar121;
                    auVar166 = vcmpps_avx(auVar170._0_32_,auVar111,2);
                    auVar155 = vandps_avx(auVar166,local_560);
                    local_560 = local_560 & auVar166;
                    bVar72 = (local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar73 = (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar71 = (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar70 = SUB321(local_560 >> 0x7f,0) != '\0';
                    bVar69 = (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar68 = SUB321(local_560 >> 0xbf,0) != '\0';
                    bVar66 = (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar65 = local_560[0x1f] < '\0';
                    if (((((((bVar72 || bVar73) || bVar71) || bVar70) || bVar69) || bVar68) ||
                        bVar66) || bVar65) {
                      auVar139._8_4_ = 0x7f800000;
                      auVar139._0_8_ = 0x7f8000007f800000;
                      auVar139._12_4_ = 0x7f800000;
                      auVar139._16_4_ = 0x7f800000;
                      auVar139._20_4_ = 0x7f800000;
                      auVar139._24_4_ = 0x7f800000;
                      auVar139._28_4_ = 0x7f800000;
                      auVar166 = vblendvps_avx(auVar139,auVar170._0_32_,auVar155);
                      auVar110 = vshufps_avx(auVar166,auVar166,0xb1);
                      auVar110 = vminps_avx(auVar166,auVar110);
                      auVar134 = vshufpd_avx(auVar110,auVar110,5);
                      auVar110 = vminps_avx(auVar110,auVar134);
                      auVar134 = vpermpd_avx2(auVar110,0x4e);
                      auVar170 = ZEXT3264(auVar134);
                      auVar110 = vminps_avx(auVar110,auVar134);
                      auVar110 = vcmpps_avx(auVar166,auVar110,0);
                      auVar134 = auVar155 & auVar110;
                      auVar166 = auVar155;
                      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar134 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar134 >> 0x7f,0) != '\0') ||
                            (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar134 >> 0xbf,0) != '\0') ||
                          (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar134[0x1f] < '\0') {
                        auVar166 = vandps_avx(auVar110,auVar155);
                      }
                      uVar93 = vmovmskps_avx(auVar166);
                      local_8a0._0_4_ = 0;
                      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                        local_8a0._0_4_ = local_8a0._0_4_ + 1;
                      }
                      local_8a0._4_4_ = 0;
                      local_8a0._8_24_ = auVar160._8_24_;
                    }
                    local_560 = auVar155;
                  } while (((((((bVar72 || bVar73) || bVar71) || bVar70) || bVar69) || bVar68) ||
                           bVar66) || bVar65);
                }
              }
            }
          }
          auVar141 = ZEXT3264(local_6c0);
          lVar92 = lVar92 + 8;
        } while ((int)lVar92 < iVar8);
      }
      uVar121 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar102._4_4_ = uVar121;
      auVar102._0_4_ = uVar121;
      auVar102._8_4_ = uVar121;
      auVar102._12_4_ = uVar121;
      auVar201 = vcmpps_avx(local_140,auVar102,2);
      uVar93 = vmovmskps_avx(auVar201);
      uVar89 = uVar89 & uVar89 + 0xf & uVar93;
    } while (uVar89 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }